

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4hc.c
# Opt level: O3

int LZ4HC_compress_optimal
              (LZ4HC_CCtx_internal *ctx,char *source,char *dst,int *srcSizePtr,int dstCapacity,
              int nbSearches,size_t sufficient_len,limitedOutput_directive limit,int fullUpdate,
              dictCtx_directive dict,HCfavor_e favorDecSpeed)

{
  void *pvVar1;
  ushort uVar2;
  LZ4_byte *pLVar3;
  byte bVar4;
  U32 UVar5;
  uint uVar6;
  uint uVar7;
  BYTE *s;
  void *pvVar8;
  long lVar9;
  ulong *puVar10;
  ulong uVar11;
  ulong uVar12;
  uint *puVar13;
  char *pcVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  ulong *puVar18;
  ulong *puVar19;
  LZ4_byte *pLVar20;
  LZ4_byte *pLVar21;
  int iVar22;
  char *pcVar23;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  long lVar28;
  int *piVar29;
  ulong *puVar30;
  long lVar31;
  int iVar32;
  uint uVar33;
  uint uVar34;
  ulong *puVar35;
  char *__n;
  ulong *puVar36;
  ulong *puVar37;
  ulong uVar38;
  undefined2 uVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  uint uVar43;
  ulong *puVar44;
  BYTE *base;
  ulong uVar45;
  uint uVar46;
  uint uVar47;
  int iVar48;
  int iVar49;
  U32 *hashTable;
  ulong uVar50;
  int iVar51;
  int iVar52;
  BYTE *e;
  ulong uVar53;
  char *pcVar54;
  bool bVar55;
  ulong *local_1f0;
  ulong *local_1d0;
  ulong *local_1c8;
  long local_1b8;
  undefined4 local_1a4;
  ulong *local_1a0;
  ulong *local_198;
  ulong *local_190;
  ulong local_188;
  LZ4_byte *local_180;
  ulong *local_178;
  uint local_16c;
  uint *local_168;
  void *local_160;
  ulong *local_158;
  char *local_150;
  ulong *local_148;
  ulong *local_140;
  ulong local_138;
  ulong *local_130;
  ulong *local_128;
  ulong *local_120;
  uint local_114;
  ulong *local_110;
  ulong *local_108;
  ulong local_100;
  int *local_f8;
  ulong local_f0;
  LZ4HC_CCtx_internal *local_e8;
  LZ4_byte *local_e0;
  char *local_d8;
  char *local_d0;
  uint local_c4;
  ulong local_c0;
  ulong local_b8;
  char *local_b0;
  ulong *local_a8;
  ulong *local_a0;
  uint local_94;
  long local_90;
  size_t local_88;
  void *local_80;
  int *local_78;
  int *local_70;
  int *local_68;
  int *local_60;
  char *local_58;
  int *local_50;
  char *local_48;
  int *local_40;
  long local_38;
  char *pcVar24;
  
  local_114 = nbSearches;
  pvVar8 = malloc(0x10030);
  iVar52 = 0;
  if (pvVar8 != (void *)0x0) {
    lVar9 = (long)*srcSizePtr;
    local_b0 = source + lVar9;
    puVar35 = (ulong *)(source + lVar9 + -0xc);
    local_58 = dst + dstCapacity;
    *srcSizePtr = 0;
    local_d0 = local_58 + (ulong)(limit != fillOutput) * 5 + -5;
    local_88 = 0xfff;
    if (sufficient_len < 0xfff) {
      local_88 = sufficient_len;
    }
    local_d8 = dst;
    local_48 = source;
    local_40 = srcSizePtr;
    if (source <= puVar35) {
      puVar10 = (ulong *)(source + lVar9 + -5);
      local_108 = (ulong *)(local_b0 + -8);
      local_110 = (ulong *)(local_b0 + -6);
      local_50 = (int *)((long)pvVar8 + 0xc);
      local_60 = (int *)((long)pvVar8 + 0x4c);
      local_90 = (long)pvVar8 + 0x1c;
      local_68 = (int *)((long)pvVar8 + 0x20);
      local_70 = (int *)((long)pvVar8 + 0x50);
      local_1c8 = (ulong *)source;
      local_160 = pvVar8;
      do {
        pLVar3 = ctx->base;
        uVar50 = (long)local_1c8 - (long)pLVar3;
        uVar26 = ctx->lowLimit;
        local_f0 = (ulong)uVar26;
        local_c4 = uVar26 + 0x10000;
        uVar34 = (uint)uVar50;
        uVar33 = uVar34 - 0xffff;
        if (uVar34 < local_c4) {
          uVar33 = uVar26;
        }
        uVar26 = (uint)*local_1c8;
        uVar11 = (ulong)ctx->nextToUpdate;
        if (ctx->nextToUpdate < uVar34) {
          do {
            uVar16 = (uint)(*(int *)(pLVar3 + uVar11) * -0x61c8864f) >> 0x11;
            uVar7 = (uint)uVar11;
            uVar25 = uVar7 - ctx->hashTable[uVar16];
            if (0xfffe < uVar25) {
              uVar25 = 0xffff;
            }
            ctx->chainTable[uVar7 & 0xffff] = (LZ4_u16)uVar25;
            ctx->hashTable[uVar16] = uVar7;
            uVar11 = uVar11 + 1;
          } while (uVar11 < (uVar50 & 0xffffffff));
        }
        local_e8 = ctx->dictCtx;
        local_e0 = ctx->dictBase;
        uVar7 = ctx->dictLimit;
        uVar11 = (ulong)uVar7;
        local_148 = (ulong *)(pLVar3 + uVar11);
        ctx->nextToUpdate = uVar34;
        uVar16 = ctx->hashTable[(uint)*local_1c8 * -0x61c8864f >> 0x11];
        local_178 = (ulong *)((long)local_1c8 + 4);
        local_190 = (ulong *)((long)local_1c8 + 0xc);
        local_a8 = local_148 + 1;
        local_138 = CONCAT71(local_138._1_7_,
                             uVar26 >> 0x18 == (uVar26 & 0xff) &&
                             uVar26 >> 0x10 == (uVar26 & 0xffff));
        local_140 = (ulong *)(local_e0 + local_f0);
        local_130 = (ulong *)(local_e0 + uVar11);
        local_a0 = (ulong *)(local_e0 + local_f0 + 4);
        local_198 = (ulong *)source;
        local_150 = dst;
        if (uVar33 <= uVar16 && 0 < (int)local_114) {
          local_1a0 = (ulong *)(ulong)(-(int)local_1c8 - 4);
          iVar52 = 0;
          local_1d0 = (ulong *)0x3;
          iVar48 = 0;
          local_158 = (ulong *)0x0;
          local_168 = (uint *)0x0;
          uVar25 = local_114;
LAB_0011c1b8:
          uVar12 = (ulong)uVar25;
          if ((favorDecSpeed != favorCompressionRatio) && (uVar34 - uVar16 < 8)) {
            puVar18 = (ulong *)0x0;
            goto LAB_0011c5b4;
          }
          if (uVar7 < uVar16 || uVar7 - uVar16 == 0) {
            puVar13 = (uint *)(pLVar3 + uVar16);
            if (*(short *)((long)local_1c8 + (long)(int)local_1d0 + -1) ==
                *(short *)((long)(int)local_1d0 + -1 + (long)puVar13)) {
              if (*puVar13 == uVar26) {
                puVar18 = (ulong *)(puVar13 + 1);
                puVar36 = local_178;
                if (local_178 < puVar35) {
                  if (*puVar18 == *local_178) {
                    puVar18 = (ulong *)(puVar13 + 3);
                    puVar36 = local_190;
                    goto LAB_0011c30f;
                  }
                  uVar38 = *local_178 ^ *puVar18;
                  lVar9 = 0;
                  if (uVar38 != 0) {
                    for (; (uVar38 >> lVar9 & 1) == 0; lVar9 = lVar9 + 1) {
                    }
                  }
                  uVar46 = (uint)lVar9 >> 3;
                }
                else {
LAB_0011c30f:
                  if (puVar36 < puVar35) {
                    iVar15 = (int)local_1a0 + (int)puVar36;
LAB_0011c324:
                    if (*puVar18 == *puVar36) goto code_r0x0011c333;
                    uVar45 = *puVar36 ^ *puVar18;
                    uVar38 = 0;
                    if (uVar45 != 0) {
                      for (; (uVar45 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
                      }
                    }
                    uVar46 = ((uint)(uVar38 >> 3) & 0x1fffffff) + iVar15;
                    goto LAB_0011c536;
                  }
LAB_0011c343:
                  if ((puVar36 < local_108) && ((uint)*puVar18 == (uint)*puVar36)) {
                    puVar36 = (ulong *)((long)puVar36 + 4);
                    puVar18 = (ulong *)((long)puVar18 + 4);
                  }
                  if ((puVar36 < local_110) && ((short)*puVar18 == (short)*puVar36)) {
                    puVar36 = (ulong *)((long)puVar36 + 2);
                    puVar18 = (ulong *)((long)puVar18 + 2);
                  }
                  if (puVar36 < puVar10) {
                    puVar36 = (ulong *)((long)puVar36 + (ulong)((char)*puVar18 == (char)*puVar36));
                  }
                  uVar46 = (int)puVar36 - (int)local_178;
                }
LAB_0011c536:
                uVar46 = uVar46 + 4;
                puVar18 = (ulong *)(ulong)uVar46;
                if ((int)local_1d0 < (int)uVar46) {
                  local_168 = puVar13;
                }
                bVar55 = (int)local_1d0 < (int)uVar46;
                local_1d0 = (ulong *)((ulong)local_1d0 & 0xffffffff);
                local_188 = uVar12;
                if (bVar55) {
                  local_1d0 = (ulong *)(ulong)uVar46;
                }
              }
              else {
                puVar18 = (ulong *)0x0;
              }
            }
            else {
              puVar18 = (ulong *)0x0;
            }
          }
          else {
            if (*(uint *)(local_e0 + uVar16) != uVar26) {
              puVar18 = (ulong *)0x0;
              goto LAB_0011c5b4;
            }
            puVar36 = (ulong *)((ulong)(uVar7 - uVar16) + (long)local_1c8);
            puVar18 = puVar36;
            if (puVar10 < puVar36) {
              puVar18 = puVar10;
            }
            puVar19 = (ulong *)(local_e0 + (ulong)uVar16 + 4);
            puVar37 = (ulong *)((long)puVar18 - 7);
            puVar44 = local_178;
            if (local_178 < puVar37) {
              if (*puVar19 == *local_178) {
                puVar19 = (ulong *)(local_e0 + (ulong)uVar16 + 0xc);
                puVar44 = local_190;
                goto LAB_0011c250;
              }
              uVar45 = *local_178 ^ *puVar19;
              uVar38 = 0;
              if (uVar45 != 0) {
                for (; (uVar45 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
                }
              }
              uVar46 = (uint)(uVar38 >> 3) & 0x1fffffff;
            }
            else {
LAB_0011c250:
              if (puVar44 < puVar37) {
                iVar15 = (int)local_1a0 + (int)puVar44;
LAB_0011c263:
                if (*puVar19 == *puVar44) goto code_r0x0011c272;
                uVar45 = *puVar44 ^ *puVar19;
                uVar38 = 0;
                if (uVar45 != 0) {
                  for (; (uVar45 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
                  }
                }
                uVar46 = ((uint)(uVar38 >> 3) & 0x1fffffff) + iVar15;
                local_188 = uVar12;
                goto LAB_0011c40e;
              }
LAB_0011c283:
              if ((puVar44 < (ulong *)((long)puVar18 - 3U)) && ((uint)*puVar19 == (uint)*puVar44)) {
                puVar44 = (ulong *)((long)puVar44 + 4);
                puVar19 = (ulong *)((long)puVar19 + 4);
              }
              if ((puVar44 < (ulong *)((long)puVar18 - 1U)) && ((short)*puVar19 == (short)*puVar44))
              {
                puVar44 = (ulong *)((long)puVar44 + 2);
                puVar19 = (ulong *)((long)puVar19 + 2);
              }
              if (puVar44 < puVar18) {
                puVar44 = (ulong *)((long)puVar44 + (ulong)((char)*puVar19 == (char)*puVar44));
              }
              uVar46 = (int)puVar44 - (int)local_178;
              local_188 = uVar12;
            }
LAB_0011c40e:
            uVar47 = uVar46 + 4;
            if ((puVar18 < puVar10) &&
               ((ulong *)((long)local_1c8 + (long)(int)uVar46 + 4) == puVar18)) {
              puVar19 = puVar18;
              puVar37 = local_148;
              if (puVar18 < puVar35) {
                if (*local_148 == *puVar18) {
                  puVar19 = puVar18 + 1;
                  puVar37 = local_a8;
                  goto LAB_0011c46c;
                }
                uVar45 = *puVar18 ^ *local_148;
                uVar38 = 0;
                if (uVar45 != 0) {
                  for (; (uVar45 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
                  }
                }
                uVar46 = (uint)(uVar38 >> 3) & 0x1fffffff;
              }
              else {
LAB_0011c46c:
                if (puVar19 < puVar35) {
                  if (puVar10 < puVar36) {
                    puVar36 = puVar10;
                  }
                  iVar15 = (int)puVar19 - (int)puVar36;
LAB_0011c486:
                  if (*puVar37 == *puVar19) goto code_r0x0011c495;
                  uVar45 = *puVar19 ^ *puVar37;
                  uVar38 = 0;
                  if (uVar45 != 0) {
                    for (; (uVar45 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
                    }
                  }
                  uVar46 = ((uint)(uVar38 >> 3) & 0x1fffffff) + iVar15;
                  goto LAB_0011c589;
                }
LAB_0011c4a6:
                if ((puVar19 < local_108) && ((uint)*puVar37 == (uint)*puVar19)) {
                  puVar19 = (ulong *)((long)puVar19 + 4);
                  puVar37 = (ulong *)((long)puVar37 + 4);
                }
                if ((puVar19 < local_110) && ((short)*puVar37 == (short)*puVar19)) {
                  puVar19 = (ulong *)((long)puVar19 + 2);
                  puVar37 = (ulong *)((long)puVar37 + 2);
                }
                if (puVar19 < puVar10) {
                  puVar19 = (ulong *)((long)puVar19 + (ulong)((char)*puVar37 == (char)*puVar19));
                }
                uVar46 = (int)puVar19 - (int)puVar18;
              }
LAB_0011c589:
              uVar47 = uVar47 + uVar46;
            }
            puVar18 = (ulong *)(ulong)uVar47;
            if ((int)local_1d0 < (int)uVar47) {
              local_168 = (uint *)(pLVar3 + uVar16);
            }
            bVar55 = (int)local_1d0 < (int)uVar47;
            local_1d0 = (ulong *)((ulong)local_1d0 & 0xffffffff);
            if (bVar55) {
              local_1d0 = puVar18;
            }
          }
LAB_0011c5b4:
          uVar46 = uVar25 - 1;
          iVar41 = (int)puVar18;
          iVar15 = (int)local_1d0;
          if (((iVar41 == iVar15) && (iVar15 + uVar16 <= uVar34)) && (3 < iVar41)) {
            iVar32 = 0;
            iVar42 = 0x10;
            uVar47 = 1;
            do {
              uVar2 = ctx->chainTable[(ushort)((short)iVar32 + (short)uVar16)];
              iVar40 = iVar42 >> 4;
              uVar17 = (uint)uVar2;
              bVar55 = uVar47 < uVar17;
              iVar42 = iVar42 + 1;
              if (bVar55) {
                iVar42 = 0x10;
              }
              uVar43 = (uint)uVar2;
              if (uVar17 < uVar47) {
                uVar43 = uVar47;
              }
              uVar47 = uVar43;
              if (bVar55) {
                iVar52 = iVar32;
              }
              iVar32 = iVar40 + iVar32;
            } while (iVar32 < iVar41 + -3);
            bVar55 = uVar16 < uVar47;
            uVar17 = uVar47;
            if (uVar16 < uVar47) {
              uVar17 = 0;
            }
            if (uVar47 < 2) goto LAB_0011c652;
            uVar16 = uVar16 - uVar17;
            local_1d0 = puVar18;
LAB_0011c787:
            uVar25 = (uint)uVar12;
            if (bVar55) goto LAB_0011caf0;
          }
          else {
LAB_0011c652:
            if ((ctx->chainTable[uVar16 & 0xffff] == 1) && (iVar52 == 0)) {
              if (iVar48 == 0) {
                iVar48 = 1;
                if ((char)local_138 == '\0') goto LAB_0011c79a;
                uVar47 = LZ4HC_countPattern((BYTE *)local_178,(BYTE *)puVar10,uVar26);
                local_158 = (ulong *)((ulong)uVar47 + 4);
                iVar48 = 2;
              }
              puVar18 = local_130;
              if (((iVar48 == 2) && (uVar47 = uVar16 - 1, uVar33 <= uVar47)) &&
                 (iVar48 = 2, uVar47 - uVar7 < 0xfffffffd)) {
                pLVar20 = local_e0;
                if (uVar7 <= uVar47) {
                  pLVar20 = pLVar3;
                }
                if (*(uint *)(pLVar20 + uVar47) == uVar26) {
                  puVar19 = (ulong *)(pLVar20 + uVar47);
                  puVar36 = local_130;
                  if (uVar7 <= uVar47) {
                    puVar36 = puVar10;
                  }
                  local_188 = uVar12;
                  uVar16 = LZ4HC_countPattern((BYTE *)((long)puVar19 + 4),(BYTE *)puVar36,uVar26);
                  local_1f0 = (ulong *)((ulong)uVar16 + 4);
                  puVar36 = local_148;
                  if ((uVar47 < uVar7) &&
                     (puVar36 = local_140, (ulong *)((long)puVar19 + (long)local_1f0) == puVar18)) {
                    bVar4 = (char)uVar16 * '\b' & 0x1f;
                    UVar5 = uVar26 << bVar4 | uVar26 >> 0x20 - bVar4;
                    if ((uVar16 & 3) == 0) {
                      UVar5 = uVar26;
                    }
                    uVar16 = LZ4HC_countPattern((BYTE *)local_148,(BYTE *)puVar10,UVar5);
                    local_1f0 = (ulong *)((long)local_1f0 + (ulong)uVar16);
                    puVar36 = local_140;
                  }
                  uVar25 = (uint)local_188;
                  puVar18 = puVar19;
                  do {
                    puVar37 = puVar18;
                    if (puVar37 < (ulong *)((long)puVar36 + 4U)) break;
                    puVar18 = (ulong *)((long)puVar37 + -4);
                  } while (*(uint *)((long)puVar37 + -4) == uVar26);
                  puVar18 = puVar37;
                  if (puVar36 < puVar37) {
                    lVar9 = 0;
                    do {
                      if (*(char *)((long)puVar37 + lVar9 + -1) !=
                          *(char *)((long)&local_1a4 + lVar9 + 3)) {
                        puVar18 = (ulong *)((long)puVar37 + lVar9);
                        break;
                      }
                      lVar28 = lVar9 + -1;
                      lVar9 = lVar9 + -1;
                      puVar18 = puVar36;
                    } while (puVar36 < (ulong *)((long)puVar37 + lVar28));
                  }
                  uVar12 = (long)puVar19 - (long)puVar18;
                  iVar52 = (int)uVar12;
                  local_1a4 = uVar26;
                  if (((uint)local_f0 < uVar7 && uVar7 <= uVar47) &&
                      (ulong *)((long)puVar19 - (uVar12 & 0xffffffff)) == local_148) {
                    bVar4 = (char)uVar12 * -8 & 0x1f;
                    puVar18 = local_130;
                    local_1a4 = uVar26 << bVar4 | uVar26 >> 0x20 - bVar4;
                    if ((-iVar52 & 3U) == 0) {
                      local_1a4 = uVar26;
                    }
                    do {
                      puVar36 = puVar18;
                      if (puVar36 < local_a0) break;
                      puVar18 = (ulong *)((long)puVar36 + -4);
                    } while (*(uint *)((long)puVar36 + -4) == local_1a4);
                    puVar18 = puVar36;
                    if (local_140 < puVar36) {
                      lVar9 = 0;
                      do {
                        if (*(char *)((long)puVar36 + lVar9 + -1) !=
                            *(char *)((long)&local_1a4 + lVar9 + 3)) {
                          puVar18 = (ulong *)((long)puVar36 + lVar9);
                          break;
                        }
                        lVar28 = lVar9 + -1;
                        lVar9 = lVar9 + -1;
                        puVar18 = local_140;
                      } while (local_140 < (ulong *)((long)puVar36 + lVar28));
                    }
                    iVar52 = ((int)local_130 - (int)puVar18) + iVar52;
                  }
                  uVar17 = uVar47 - iVar52;
                  if (uVar47 - iVar52 <= uVar33) {
                    uVar17 = uVar33;
                  }
                  puVar18 = (ulong *)((ulong)(uVar47 - uVar17) + (long)local_1f0);
                  if ((local_1f0 <= local_158) && (local_158 <= puVar18)) {
                    uVar16 = (uVar47 - (int)local_158) + (int)local_1f0;
                    if (0xfffffffc < uVar16 - uVar7) {
                      uVar16 = uVar7;
                    }
                    iVar52 = 0;
                    iVar48 = 2;
                    goto LAB_0011c7ad;
                  }
                  bVar55 = false;
                  iVar48 = 2;
                  uVar12 = local_188;
                  if (uVar17 - uVar7 < 0xfffffffd) {
                    if (local_158 <= puVar18) {
                      puVar18 = local_158;
                    }
                    if ((ulong *)(long)iVar15 < puVar18) {
                      if (0xffff < uVar50 - uVar17) goto LAB_0011caf0;
                      local_168 = (uint *)(pLVar3 + uVar17);
                      local_1d0 = puVar18;
                    }
                    bVar55 = false;
                    iVar52 = 0;
                    uVar16 = uVar17 - ctx->chainTable[(ulong)uVar17 & 0xffff];
                    if (ctx->chainTable[(ulong)uVar17 & 0xffff] <= uVar17) goto LAB_0011c787;
                    goto LAB_0011caf0;
                  }
                  iVar52 = 0;
                  uVar16 = uVar7;
                  goto LAB_0011c787;
                }
              }
            }
LAB_0011c79a:
            uVar16 = uVar16 - ctx->chainTable[(ushort)((short)iVar52 + (short)uVar16)];
          }
LAB_0011c7ad:
          if ((uVar16 < uVar33) || (bVar55 = (int)uVar25 < 2, uVar25 = uVar46, bVar55))
          goto LAB_0011caf0;
          goto LAB_0011c1b8;
        }
        local_1d0 = (ulong *)0x3;
        local_168 = (uint *)0x0;
        uVar46 = local_114;
LAB_0011caf0:
        if (((dict == usingDictCtxHc) && (0 < (int)uVar46)) && (uVar34 - uVar33 < 0xffff)) {
          pLVar20 = local_e8->base;
          lVar9 = (long)local_e8->end - (long)pLVar20;
          uVar16 = local_e8->hashTable[(uint)*local_1c8 * -0x61c8864f >> 0x11];
          uVar33 = (uVar33 + uVar16) - (int)lVar9;
          if (uVar34 - uVar33 < 0x10000) {
            do {
              bVar55 = uVar46 == 0;
              uVar46 = uVar46 - 1;
              if (bVar55) break;
              uVar50 = (ulong)uVar16;
              if (*(uint *)(pLVar20 + uVar50) == uVar26) {
                puVar18 = (ulong *)((lVar9 - uVar50) + (long)local_1c8);
                if (puVar10 < puVar18) {
                  puVar18 = puVar10;
                }
                puVar36 = (ulong *)(pLVar20 + uVar50 + 4);
                puVar19 = (ulong *)((long)puVar18 - 7);
                puVar37 = local_178;
                if (local_178 < puVar19) {
                  if (*puVar36 == *local_178) {
                    puVar36 = (ulong *)(pLVar20 + uVar50 + 0xc);
                    puVar37 = local_190;
                    goto LAB_0011cbe4;
                  }
                  uVar50 = *local_178 ^ *puVar36;
                  lVar28 = 0;
                  if (uVar50 != 0) {
                    for (; (uVar50 >> lVar28 & 1) == 0; lVar28 = lVar28 + 1) {
                    }
                  }
                  uVar25 = (uint)lVar28 >> 3;
                }
                else {
LAB_0011cbe4:
                  if (puVar37 < puVar19) {
                    iVar52 = (-4 - (int)local_1c8) + (int)puVar37;
LAB_0011cbf4:
                    if (*puVar36 == *puVar37) goto code_r0x0011cc03;
                    uVar12 = *puVar37 ^ *puVar36;
                    uVar50 = 0;
                    if (uVar12 != 0) {
                      for (; (uVar12 >> uVar50 & 1) == 0; uVar50 = uVar50 + 1) {
                      }
                    }
                    uVar25 = ((uint)(uVar50 >> 3) & 0x1fffffff) + iVar52;
                    goto LAB_0011ccae;
                  }
LAB_0011cc14:
                  if ((puVar37 < (ulong *)((long)puVar18 - 3U)) &&
                     ((uint)*puVar36 == (uint)*puVar37)) {
                    puVar37 = (ulong *)((long)puVar37 + 4);
                    puVar36 = (ulong *)((long)puVar36 + 4);
                  }
                  if ((puVar37 < (ulong *)((long)puVar18 - 1U)) &&
                     ((short)*puVar36 == (short)*puVar37)) {
                    puVar37 = (ulong *)((long)puVar37 + 2);
                    puVar36 = (ulong *)((long)puVar36 + 2);
                  }
                  if (puVar37 < puVar18) {
                    puVar37 = (ulong *)((long)puVar37 + (ulong)((char)*puVar36 == (char)*puVar37));
                  }
                  uVar25 = (int)puVar37 - (int)local_178;
                }
LAB_0011ccae:
                if ((int)local_1d0 < (int)(uVar25 + 4)) {
                  local_168 = (uint *)(pLVar3 + uVar33);
                  local_1d0 = (ulong *)(ulong)(uVar25 + 4);
                }
              }
              uVar25 = uVar16 & 0xffff;
              uVar16 = uVar16 - local_e8->chainTable[uVar25];
              uVar33 = uVar33 - local_e8->chainTable[uVar25];
            } while (uVar34 - uVar33 < 0x10000);
          }
        }
        pvVar8 = local_160;
        if (3 < (int)local_1d0) {
          uVar12 = (long)local_1c8 - (long)local_198;
          uVar50 = (ulong)local_1d0 & 0xffffffff;
          if ((int)local_1d0 - 0x13U < 0x12) {
            uVar50 = 0x12;
          }
          if (favorDecSpeed == favorCompressionRatio) {
            uVar50 = (ulong)local_1d0 & 0xffffffff;
          }
          lVar9 = (long)local_1c8 - (long)local_168;
          iVar48 = (int)uVar12;
          iVar52 = (int)lVar9;
          local_188 = uVar50;
          if (uVar50 <= local_88) {
            iVar15 = (int)local_1c8 - (int)local_198;
            uVar26 = iVar15 - 0xf;
            lVar9 = 0;
            piVar29 = local_50;
            do {
              iVar41 = iVar48;
              if (0xe < iVar48 + lVar9) {
                iVar41 = uVar26 / 0xff + iVar15 + 1;
              }
              piVar29[-2] = 0;
              piVar29[-1] = 1;
              *piVar29 = iVar15 + (int)lVar9;
              piVar29[-3] = iVar41 + (int)lVar9;
              lVar9 = lVar9 + 1;
              uVar26 = uVar26 + 1;
              piVar29 = piVar29 + 4;
            } while (lVar9 != 4);
            local_188._0_4_ = (int)uVar50;
            if (3 < (int)local_188) {
              iVar15 = iVar48 + 1 + (iVar48 - 0xfU) / 0xff;
              if (iVar48 < 0xf) {
                iVar15 = iVar48;
              }
              uVar12 = 4;
              uVar26 = 0xfffffff1;
              piVar29 = local_60;
              do {
                iVar41 = iVar15 + 3;
                if (0x12 < uVar12) {
                  iVar41 = uVar26 / 0xff + iVar15 + 3 + 1;
                }
                piVar29[-1] = uVar26 + 0x13;
                piVar29[-2] = iVar52;
                *piVar29 = iVar48;
                piVar29[-3] = iVar41;
                uVar12 = uVar12 + 1;
                uVar26 = uVar26 + 1;
                piVar29 = piVar29 + 4;
              } while ((int)local_188 + 1 != uVar12);
            }
            lVar9 = uVar50 * 0x10 + local_90;
            iVar52 = 1;
            lVar28 = 0;
            do {
              *(undefined8 *)(lVar9 + -8 + lVar28) = 0x100000000;
              *(int *)(lVar9 + lVar28) = iVar52;
              *(int *)(lVar9 + -0xc + lVar28) = *(int *)(uVar50 * 0x10 + (long)local_160) + iVar52;
              lVar28 = lVar28 + 0x10;
              iVar52 = iVar52 + 1;
            } while (lVar28 != 0x30);
            bVar55 = 1 < (int)local_188;
            if (bVar55) {
              local_168 = (uint *)(ulong)(((int)local_1c8 - (int)pLVar3) + 1);
              local_138 = (ulong)(-(int)local_1c8 - 5);
              puVar36 = (ulong *)0x1;
              local_1b8 = 5;
              local_78 = local_68;
              piVar29 = local_70;
              puVar18 = local_1c8;
              do {
                puVar18 = (ulong *)((long)puVar18 + 1);
                puVar19 = (ulong *)((long)local_1c8 + (long)puVar36);
                if (puVar35 < puVar19) break;
                local_38 = (long)puVar36 * 0x10;
                pvVar1 = (void *)(local_38 + (long)pvVar8);
                iVar52 = *(int *)((long)pvVar8 + local_38);
                iVar48 = *(int *)((long)pvVar8 + local_38 + 0x10);
                local_188 = uVar50;
                if (fullUpdate == 0) {
                  if (iVar52 < iVar48) {
                    uVar26 = (uint)((long)puVar19 - (long)pLVar3);
                    uVar34 = uVar26 - 0xffff;
                    if (uVar26 < local_c4) {
                      uVar34 = (uint)local_f0;
                    }
                    uVar33 = (uint)*puVar19;
                    puVar13 = (uint *)(ulong)ctx->nextToUpdate;
                    if (ctx->nextToUpdate < uVar26) {
                      do {
                        uVar25 = (uint)(*(int *)(pLVar3 + (long)puVar13) * -0x61c8864f) >> 0x11;
                        uVar16 = (uint)puVar13;
                        uVar46 = uVar16 - ctx->hashTable[uVar25];
                        if (0xfffe < uVar46) {
                          uVar46 = 0xffff;
                        }
                        ctx->chainTable[uVar16 & 0xffff] = (LZ4_u16)uVar46;
                        ctx->hashTable[uVar25] = uVar16;
                        puVar13 = (uint *)((long)puVar13 + 1);
                      } while (local_168 != puVar13);
                    }
                    local_178._0_4_ = (int)puVar36;
                    local_94 = (int)uVar50 - (int)local_178;
                    ctx->nextToUpdate = uVar26;
                    uVar50 = (ulong)ctx->hashTable[(uint)*puVar19 * -0x61c8864f >> 0x11];
                    puVar37 = (ulong *)((long)puVar19 + 4);
                    local_c0 = CONCAT71(local_c0._1_7_,
                                        uVar33 >> 0x18 == (uVar33 & 0xff) &&
                                        uVar33 >> 0x10 == (uVar33 & 0xffff));
                    local_128 = (ulong *)((long)puVar19 + 0xc);
                    local_1a0 = puVar37;
                    if (uVar34 <= ctx->hashTable[(uint)*puVar19 * -0x61c8864f >> 0x11] &&
                        0 < (int)local_114) {
                      iVar52 = 0;
                      iVar48 = 0;
                      local_100 = 0;
                      local_190 = (ulong *)0x0;
                      puVar44 = (ulong *)(ulong)local_94;
                      uVar16 = local_114;
                      local_178 = puVar36;
                      local_120 = puVar18;
                      local_f8 = piVar29;
                      local_80 = pvVar1;
LAB_0011db56:
                      pLVar20 = (LZ4_byte *)(ulong)uVar16;
                      uVar25 = (uint)uVar50;
                      if ((favorDecSpeed == favorCompressionRatio) || (7 < uVar26 - uVar25)) {
                        uVar46 = uVar7 - uVar25;
                        iVar15 = (int)puVar44;
                        if (uVar7 < uVar25 || uVar46 == 0) {
                          puVar18 = (ulong *)(pLVar3 + uVar50);
                          if ((*(short *)((long)puVar19 + (long)iVar15 + -1) !=
                               *(short *)((long)iVar15 + -1 + (long)puVar18)) ||
                             ((uint)*puVar18 != uVar33)) {
                            puVar30 = (ulong *)0x0;
                            goto LAB_0011dee3;
                          }
                          puVar36 = (ulong *)((long)puVar18 + 4);
                          puVar30 = puVar37;
                          if (puVar37 < puVar35) {
                            if (*puVar36 == *puVar37) {
                              puVar36 = (ulong *)((long)puVar18 + 0xc);
                              puVar30 = local_128;
                              goto LAB_0011dc95;
                            }
                            uVar12 = *puVar37 ^ *puVar36;
                            lVar9 = 0;
                            if (uVar12 != 0) {
                              for (; (uVar12 >> lVar9 & 1) == 0; lVar9 = lVar9 + 1) {
                              }
                            }
                            uVar46 = (uint)lVar9 >> 3;
                          }
                          else {
LAB_0011dc95:
                            if (puVar30 < puVar35) {
                              iVar41 = (int)local_138 + (int)puVar30;
LAB_0011dca6:
                              if (*puVar36 == *puVar30) goto code_r0x0011dcb5;
                              uVar38 = *puVar30 ^ *puVar36;
                              uVar12 = 0;
                              if (uVar38 != 0) {
                                for (; (uVar38 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
                                }
                              }
                              uVar46 = ((uint)(uVar12 >> 3) & 0x1fffffff) + iVar41;
                              goto LAB_0011de84;
                            }
LAB_0011dcc7:
                            if ((puVar30 < local_108) && ((uint)*puVar36 == (uint)*puVar30)) {
                              puVar30 = (ulong *)((long)puVar30 + 4);
                              puVar36 = (ulong *)((long)puVar36 + 4);
                            }
                            if ((puVar30 < local_110) && ((short)*puVar36 == (short)*puVar30)) {
                              puVar30 = (ulong *)((long)puVar30 + 2);
                              puVar36 = (ulong *)((long)puVar36 + 2);
                            }
                            if (puVar30 < puVar10) {
                              puVar30 = (ulong *)((long)puVar30 +
                                                 (ulong)((char)*puVar36 == (char)*puVar30));
                            }
                            uVar46 = (int)puVar30 - (int)puVar37;
                          }
LAB_0011de84:
                          uVar46 = uVar46 + 4;
                          puVar30 = (ulong *)(ulong)uVar46;
                          if (iVar15 < (int)uVar46) {
                            local_190 = puVar18;
                          }
                          puVar44 = (ulong *)((ulong)puVar44 & 0xffffffff);
                          if (iVar15 < (int)uVar46) {
                            puVar44 = (ulong *)(ulong)uVar46;
                          }
                        }
                        else {
                          if (*(uint *)(local_e0 + uVar50) != uVar33) {
                            puVar30 = (ulong *)0x0;
                            goto LAB_0011dee3;
                          }
                          puVar18 = (ulong *)((long)puVar19 + (ulong)uVar46);
                          if (puVar10 < puVar18) {
                            puVar18 = puVar10;
                          }
                          puVar36 = (ulong *)(local_e0 + uVar50 + 4);
                          puVar30 = (ulong *)((long)puVar18 - 7);
                          if (puVar37 < puVar30) {
                            if (*puVar36 == *puVar37) {
                              puVar36 = (ulong *)(local_e0 + uVar50 + 0xc);
                              puVar37 = local_128;
                              goto LAB_0011dbe1;
                            }
                            uVar38 = *puVar37 ^ *puVar36;
                            uVar12 = 0;
                            if (uVar38 != 0) {
                              for (; (uVar38 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
                              }
                            }
                            uVar47 = (uint)(uVar12 >> 3) & 0x1fffffff;
                          }
                          else {
LAB_0011dbe1:
                            if (puVar37 < puVar30) {
                              iVar41 = (int)local_138 + (int)puVar37;
LAB_0011dbf6:
                              if (*puVar36 == *puVar37) goto code_r0x0011dc05;
                              uVar38 = *puVar37 ^ *puVar36;
                              uVar12 = 0;
                              if (uVar38 != 0) {
                                for (; (uVar38 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
                                }
                              }
                              uVar47 = ((uint)(uVar12 >> 3) & 0x1fffffff) + iVar41;
                              puVar37 = local_1a0;
                              local_180 = pLVar20;
                              goto LAB_0011dd6f;
                            }
LAB_0011dc16:
                            if ((puVar37 < (ulong *)((long)puVar18 - 3U)) &&
                               ((uint)*puVar36 == (uint)*puVar37)) {
                              puVar37 = (ulong *)((long)puVar37 + 4);
                              puVar36 = (ulong *)((long)puVar36 + 4);
                            }
                            if ((puVar37 < (ulong *)((long)puVar18 - 1U)) &&
                               ((short)*puVar36 == (short)*puVar37)) {
                              puVar37 = (ulong *)((long)puVar37 + 2);
                              puVar36 = (ulong *)((long)puVar36 + 2);
                            }
                            if (puVar37 < puVar18) {
                              puVar37 = (ulong *)((long)puVar37 +
                                                 (ulong)((char)*puVar36 == (char)*puVar37));
                            }
                            uVar47 = (int)puVar37 - (int)local_1a0;
                            puVar37 = local_1a0;
                            local_180 = pLVar20;
                          }
LAB_0011dd6f:
                          uVar17 = uVar47 + 4;
                          if ((puVar18 < puVar10) &&
                             ((ulong *)((long)puVar19 + (long)(int)uVar47 + 4) == puVar18)) {
                            puVar36 = puVar18;
                            puVar30 = local_148;
                            if (puVar18 < puVar35) {
                              if (*local_148 == *puVar18) {
                                puVar36 = puVar18 + 1;
                                puVar30 = local_a8;
                                goto LAB_0011ddcb;
                              }
                              uVar38 = *puVar18 ^ *local_148;
                              uVar12 = 0;
                              if (uVar38 != 0) {
                                for (; (uVar38 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
                                }
                              }
                              uVar46 = (uint)(uVar12 >> 3) & 0x1fffffff;
                            }
                            else {
LAB_0011ddcb:
                              if (puVar36 < puVar35) {
                                puVar37 = (ulong *)((ulong)uVar46 + (long)local_120);
                                if (puVar10 < puVar37) {
                                  puVar37 = puVar10;
                                }
                                iVar41 = (int)puVar36 - (int)puVar37;
LAB_0011ddec:
                                if (*puVar30 == *puVar36) goto code_r0x0011ddfb;
                                uVar38 = *puVar36 ^ *puVar30;
                                uVar12 = 0;
                                if (uVar38 != 0) {
                                  for (; (uVar38 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
                                  }
                                }
                                uVar46 = ((uint)(uVar12 >> 3) & 0x1fffffff) + iVar41;
                                puVar37 = local_1a0;
                                goto LAB_0011debf;
                              }
LAB_0011de0e:
                              if ((puVar36 < local_108) && ((uint)*puVar30 == (uint)*puVar36)) {
                                puVar36 = (ulong *)((long)puVar36 + 4);
                                puVar30 = (ulong *)((long)puVar30 + 4);
                              }
                              if ((puVar36 < local_110) && ((short)*puVar30 == (short)*puVar36)) {
                                puVar36 = (ulong *)((long)puVar36 + 2);
                                puVar30 = (ulong *)((long)puVar30 + 2);
                              }
                              if (puVar36 < puVar10) {
                                puVar36 = (ulong *)((long)puVar36 +
                                                   (ulong)((char)*puVar30 == (char)*puVar36));
                              }
                              uVar46 = (int)puVar36 - (int)puVar18;
                              puVar37 = local_1a0;
                            }
LAB_0011debf:
                            uVar17 = uVar17 + uVar46;
                          }
                          puVar30 = (ulong *)(ulong)uVar17;
                          if (iVar15 < (int)uVar17) {
                            local_190 = (ulong *)(pLVar3 + uVar50);
                          }
                          puVar44 = (ulong *)((ulong)puVar44 & 0xffffffff);
                          if (iVar15 < (int)uVar17) {
                            puVar44 = puVar30;
                          }
                        }
                      }
                      else {
                        puVar30 = (ulong *)0x0;
                      }
LAB_0011dee3:
                      uVar46 = uVar16 - 1;
                      iVar15 = (int)puVar30;
                      if (((iVar15 == (int)puVar44) && ((int)puVar44 + uVar25 <= uVar26)) &&
                         (3 < iVar15)) {
                        iVar42 = 0;
                        iVar41 = 0x10;
                        uVar47 = 1;
                        do {
                          uVar2 = ctx->chainTable[iVar42 + uVar25 & 0xffff];
                          iVar32 = iVar41 >> 4;
                          uVar17 = (uint)uVar2;
                          bVar55 = uVar47 < uVar17;
                          iVar41 = iVar41 + 1;
                          if (bVar55) {
                            iVar41 = 0x10;
                          }
                          uVar43 = (uint)uVar2;
                          if (uVar17 < uVar47) {
                            uVar43 = uVar47;
                          }
                          uVar47 = uVar43;
                          if (bVar55) {
                            iVar52 = iVar42;
                          }
                          iVar42 = iVar32 + iVar42;
                        } while (iVar42 < iVar15 + -3);
                        bVar55 = uVar25 < uVar47;
                        uVar17 = uVar47;
                        if (uVar25 < uVar47) {
                          uVar17 = 0;
                        }
                        local_158 = puVar44;
                        if (uVar47 < 2) goto LAB_0011df8d;
                        uVar50 = (ulong)(uVar25 - uVar17);
LAB_0011e063:
                        uVar16 = (uint)pLVar20;
                        if (bVar55) goto LAB_0011e6bb;
                      }
                      else {
LAB_0011df8d:
                        if ((ctx->chainTable[uVar50 & 0xffff] == 1) && (iVar52 == 0)) {
                          if (iVar48 == 0) {
                            iVar48 = 1;
                            if ((char)local_c0 == '\0') goto LAB_0011e0eb;
                            local_16c = uVar46;
                            uVar46 = LZ4HC_countPattern((BYTE *)puVar37,(BYTE *)puVar10,uVar33);
                            local_100 = (ulong)uVar46 + 4;
                            iVar48 = 2;
                            puVar37 = local_1a0;
                            uVar46 = local_16c;
                          }
                          puVar18 = local_130;
                          if (((iVar48 == 2) && (uVar47 = uVar25 - 1, uVar34 <= uVar47)) &&
                             (iVar48 = 2, uVar47 - uVar7 < 0xfffffffd)) {
                            pLVar21 = local_e0;
                            if (uVar7 <= uVar47) {
                              pLVar21 = pLVar3;
                            }
                            local_180 = pLVar20;
                            if (*(uint *)(pLVar21 + uVar47) == uVar33) {
                              puVar37 = (ulong *)(pLVar21 + uVar47);
                              puVar36 = local_130;
                              if (uVar7 <= uVar47) {
                                puVar36 = puVar10;
                              }
                              local_158 = puVar44;
                              uVar16 = LZ4HC_countPattern((BYTE *)((long)puVar37 + 4),
                                                          (BYTE *)puVar36,uVar33);
                              uVar50 = (ulong)uVar16 + 4;
                              puVar36 = local_148;
                              local_16c = uVar46;
                              if ((uVar47 < uVar7) &&
                                 (puVar36 = local_140, (ulong *)((long)puVar37 + uVar50) == puVar18)
                                 ) {
                                bVar4 = (char)uVar16 * '\b' & 0x1f;
                                UVar5 = uVar33 << bVar4 | uVar33 >> 0x20 - bVar4;
                                if ((uVar16 & 3) == 0) {
                                  UVar5 = uVar33;
                                }
                                uVar16 = LZ4HC_countPattern((BYTE *)local_148,(BYTE *)puVar10,UVar5)
                                ;
                                puVar36 = local_140;
                                uVar50 = uVar50 + uVar16;
                              }
                              local_b8 = uVar50;
                              puVar18 = puVar37;
                              do {
                                puVar44 = puVar18;
                                if (puVar44 < (ulong *)((long)puVar36 + 4U)) break;
                                puVar18 = (ulong *)((long)puVar44 + -4);
                              } while (*(uint *)((long)puVar44 + -4) == uVar33);
                              puVar18 = puVar44;
                              if (puVar36 < puVar44) {
                                lVar9 = 0;
                                do {
                                  if (*(char *)((long)puVar44 + lVar9 + -1) !=
                                      *(char *)((long)&local_1a4 + lVar9 + 3)) {
                                    puVar18 = (ulong *)((long)puVar44 + lVar9);
                                    break;
                                  }
                                  lVar28 = lVar9 + -1;
                                  lVar9 = lVar9 + -1;
                                  puVar18 = puVar36;
                                } while (puVar36 < (ulong *)((long)puVar44 + lVar28));
                              }
                              uVar50 = (long)puVar37 - (long)puVar18;
                              iVar52 = (int)uVar50;
                              local_1a4 = uVar33;
                              if (((uint)local_f0 < uVar7 && uVar7 <= uVar47) &&
                                  (ulong *)((long)puVar37 - (uVar50 & 0xffffffff)) == local_148) {
                                bVar4 = (char)uVar50 * -8 & 0x1f;
                                puVar18 = local_130;
                                local_1a4 = uVar33 << bVar4 | uVar33 >> 0x20 - bVar4;
                                if ((-iVar52 & 3U) == 0) {
                                  local_1a4 = uVar33;
                                }
                                do {
                                  puVar36 = puVar18;
                                  if (puVar36 < local_a0) break;
                                  puVar18 = (ulong *)((long)puVar36 + -4);
                                } while (*(uint *)((long)puVar36 + -4) == local_1a4);
                                puVar18 = puVar36;
                                if (local_140 < puVar36) {
                                  lVar9 = 0;
                                  do {
                                    if (*(char *)((long)puVar36 + lVar9 + -1) !=
                                        *(char *)((long)&local_1a4 + lVar9 + 3)) {
                                      puVar18 = (ulong *)((long)puVar36 + lVar9);
                                      break;
                                    }
                                    lVar28 = lVar9 + -1;
                                    lVar9 = lVar9 + -1;
                                    puVar18 = local_140;
                                  } while (local_140 < (ulong *)((long)puVar36 + lVar28));
                                }
                                iVar52 = ((int)local_130 - (int)puVar18) + iVar52;
                              }
                              uVar16 = (uint)local_180;
                              uVar25 = uVar47 - iVar52;
                              if (uVar47 - iVar52 <= uVar34) {
                                uVar25 = uVar34;
                              }
                              uVar50 = (uVar47 - uVar25) + local_b8;
                              puVar37 = local_1a0;
                              puVar30 = local_158;
                              uVar46 = local_16c;
                              if ((local_b8 <= local_100) && (local_100 <= uVar50)) {
                                uVar25 = (uVar47 - (int)local_100) + (int)local_b8;
                                if (0xfffffffc < uVar25 - uVar7) {
                                  uVar25 = uVar7;
                                }
                                iVar52 = 0;
                                iVar48 = 2;
                                uVar50 = (ulong)uVar25;
                                goto LAB_0011e0fe;
                              }
                              bVar55 = false;
                              iVar48 = 2;
                              pLVar20 = local_180;
                              if (uVar25 - uVar7 < 0xfffffffd) {
                                if (local_100 <= uVar50) {
                                  uVar50 = local_100;
                                }
                                if ((ulong)(long)(int)local_158 < uVar50) {
                                  if (0xffff < ((long)puVar19 - (long)pLVar3) - (ulong)uVar25)
                                  goto LAB_0011e6bb;
                                  local_190 = (ulong *)(pLVar3 + uVar25);
                                  puVar30 = (ulong *)(uVar50 & 0xffffffff);
                                }
                                bVar55 = false;
                                iVar52 = 0;
                                uVar50 = (ulong)(uVar25 - ctx->chainTable[(ulong)uVar25 & 0xffff]);
                                if (ctx->chainTable[(ulong)uVar25 & 0xffff] <= uVar25)
                                goto LAB_0011e063;
                                goto LAB_0011e6bb;
                              }
                              iVar52 = 0;
                              uVar50 = uVar11;
                              goto LAB_0011e063;
                            }
                          }
                        }
LAB_0011e0eb:
                        uVar50 = (ulong)(uVar25 - ctx->chainTable[uVar25 + iVar52 & 0xffff]);
                        puVar30 = puVar44;
                      }
LAB_0011e0fe:
                      if (((uint)uVar50 < uVar34) ||
                         (bVar55 = (int)uVar16 < 2, puVar44 = puVar30, uVar16 = uVar46, bVar55))
                      goto LAB_0011e6bb;
                      goto LAB_0011db56;
                    }
                    local_190 = (ulong *)0x0;
                    puVar30 = (ulong *)(ulong)local_94;
                    uVar46 = local_114;
                    local_178 = puVar36;
                    local_120 = puVar18;
                    local_f8 = piVar29;
                    local_80 = pvVar1;
LAB_0011e6bb:
                    uVar16 = (uint)puVar30;
                    if (((dict == usingDictCtxHc) && (0 < (int)uVar46)) &&
                       (uVar26 - uVar34 < 0xffff)) {
                      local_158 = (ulong *)local_e8->base;
                      lVar9 = (long)local_e8->end - (long)local_158;
                      uVar25 = local_e8->hashTable[(uint)*puVar19 * -0x61c8864f >> 0x11];
                      for (uVar34 = (uVar34 + uVar25) - (int)lVar9; uVar26 - uVar34 < 0x10000;
                          uVar34 = uVar34 - local_e8->chainTable[uVar47]) {
                        uVar16 = (uint)puVar30;
                        bVar55 = uVar46 == 0;
                        uVar46 = uVar46 - 1;
                        if (bVar55) break;
                        uVar50 = (ulong)uVar25;
                        if (*(uint *)((long)local_158 + uVar50) == uVar33) {
                          puVar18 = (ulong *)((lVar9 - uVar50) + (long)puVar19);
                          if (puVar10 < puVar18) {
                            puVar18 = puVar10;
                          }
                          puVar36 = (ulong *)((long)local_158 + uVar50 + 4);
                          puVar44 = (ulong *)((long)puVar18 - 7);
                          if (puVar37 < puVar44) {
                            if (*puVar36 == *puVar37) {
                              puVar36 = (ulong *)((long)local_158 + uVar50 + 0xc);
                              puVar37 = local_128;
                              goto LAB_0011e7b5;
                            }
                            uVar12 = *puVar37 ^ *puVar36;
                            uVar50 = 0;
                            if (uVar12 != 0) {
                              for (; (uVar12 >> uVar50 & 1) == 0; uVar50 = uVar50 + 1) {
                              }
                            }
                            uVar47 = (uint)(uVar50 >> 3) & 0x1fffffff;
                          }
                          else {
LAB_0011e7b5:
                            if (puVar37 < puVar44) {
                              iVar52 = (int)local_138 + (int)puVar37;
LAB_0011e7c5:
                              if (*puVar36 == *puVar37) goto code_r0x0011e7d0;
                              uVar12 = *puVar37 ^ *puVar36;
                              uVar50 = 0;
                              if (uVar12 != 0) {
                                for (; (uVar12 >> uVar50 & 1) == 0; uVar50 = uVar50 + 1) {
                                }
                              }
                              uVar47 = ((uint)(uVar50 >> 3) & 0x1fffffff) + iVar52;
                              puVar37 = local_1a0;
                              goto LAB_0011e850;
                            }
LAB_0011e7e1:
                            if ((puVar37 < (ulong *)((long)puVar18 - 3U)) &&
                               ((uint)*puVar36 == (uint)*puVar37)) {
                              puVar37 = (ulong *)((long)puVar37 + 4);
                              puVar36 = (ulong *)((long)puVar36 + 4);
                            }
                            if ((puVar37 < (ulong *)((long)puVar18 - 1U)) &&
                               ((short)*puVar36 == (short)*puVar37)) {
                              puVar37 = (ulong *)((long)puVar37 + 2);
                              puVar36 = (ulong *)((long)puVar36 + 2);
                            }
                            if (puVar37 < puVar18) {
                              puVar37 = (ulong *)((long)puVar37 +
                                                 (ulong)((char)*puVar36 == (char)*puVar37));
                            }
                            uVar47 = (int)puVar37 - (int)local_1a0;
                            puVar37 = local_1a0;
                          }
LAB_0011e850:
                          if ((int)uVar16 < (int)(uVar47 + 4)) {
                            local_190 = (ulong *)(pLVar3 + uVar34);
                            puVar30 = (ulong *)(ulong)(uVar47 + 4);
                          }
                        }
                        uVar16 = (uint)puVar30;
                        uVar47 = uVar25 & 0xffff;
                        uVar25 = uVar25 - local_e8->chainTable[uVar47];
                      }
                    }
                    puVar18 = local_120;
                    piVar29 = local_f8;
                    uVar50 = local_188;
                    pvVar8 = local_160;
                    puVar36 = local_178;
                    if ((int)local_94 < (int)uVar16) {
                      uVar12 = (ulong)uVar16;
                      if (uVar16 - 0x13 < 0x12) {
                        uVar12 = 0x12;
                      }
                      if (favorDecSpeed == favorCompressionRatio) {
                        uVar12 = (ulong)uVar16;
                      }
                      if ((int)uVar12 != 0) goto LAB_0011e922;
                    }
                  }
                }
                else if ((iVar52 < iVar48) || (iVar52 + 3 <= *(int *)((long)pvVar1 + 0x40))) {
                  uVar26 = (uint)((long)puVar19 - (long)pLVar3);
                  uVar34 = uVar26 - 0xffff;
                  if (uVar26 < local_c4) {
                    uVar34 = (uint)local_f0;
                  }
                  uVar33 = (uint)*puVar19;
                  puVar13 = (uint *)(ulong)ctx->nextToUpdate;
                  if (ctx->nextToUpdate < uVar26) {
                    do {
                      uVar25 = (uint)(*(int *)(pLVar3 + (long)puVar13) * -0x61c8864f) >> 0x11;
                      uVar16 = (uint)puVar13;
                      uVar46 = uVar16 - ctx->hashTable[uVar25];
                      if (0xfffe < uVar46) {
                        uVar46 = 0xffff;
                      }
                      ctx->chainTable[uVar16 & 0xffff] = (LZ4_u16)uVar46;
                      ctx->hashTable[uVar25] = uVar16;
                      puVar13 = (uint *)((long)puVar13 + 1);
                    } while (local_168 != puVar13);
                  }
                  ctx->nextToUpdate = uVar26;
                  uVar16 = ctx->hashTable[(uint)*puVar19 * -0x61c8864f >> 0x11];
                  local_158 = (ulong *)((long)puVar19 + 4);
                  local_128 = (ulong *)((long)puVar19 + 0xc);
                  local_16c = CONCAT31(local_16c._1_3_,
                                       uVar33 >> 0x18 == (uVar33 & 0xff) &&
                                       uVar33 >> 0x10 == (uVar33 & 0xffff));
                  if (uVar34 <= uVar16 && 0 < (int)local_114) {
                    iVar52 = 0;
                    uVar46 = 3;
                    iVar48 = 0;
                    local_c0 = 0;
                    local_190 = (ulong *)0x0;
                    uVar25 = local_114;
                    local_178 = puVar36;
                    local_120 = puVar18;
                    local_f8 = piVar29;
                    local_80 = pvVar1;
                    do {
                      pLVar20 = (LZ4_byte *)(ulong)uVar25;
                      if ((favorDecSpeed == favorCompressionRatio) || (7 < uVar26 - uVar16)) {
                        uVar47 = uVar7 - uVar16;
                        if (uVar7 < uVar16 || uVar47 == 0) {
                          puVar18 = (ulong *)(pLVar3 + uVar16);
                          if ((*(short *)((long)puVar19 + (long)(int)uVar46 + -1) !=
                               *(short *)((long)(int)uVar46 + -1 + (long)puVar18)) ||
                             ((uint)*puVar18 != uVar33)) {
                            uVar17 = 0;
                            goto LAB_0011d4f5;
                          }
                          puVar36 = (ulong *)((long)puVar18 + 4);
                          puVar37 = local_158;
                          if (local_158 < puVar35) {
                            if (*puVar36 == *local_158) {
                              puVar36 = (ulong *)((long)puVar18 + 0xc);
                              puVar37 = local_128;
                              goto LAB_0011d2b5;
                            }
                            uVar50 = *local_158 ^ *puVar36;
                            lVar9 = 0;
                            if (uVar50 != 0) {
                              for (; (uVar50 >> lVar9 & 1) == 0; lVar9 = lVar9 + 1) {
                              }
                            }
                            uVar17 = (uint)lVar9 >> 3;
                          }
                          else {
LAB_0011d2b5:
                            if (puVar37 < puVar35) {
                              iVar15 = (int)local_138 + (int)puVar37;
LAB_0011d2c6:
                              if (*puVar36 == *puVar37) goto code_r0x0011d2d5;
                              uVar12 = *puVar37 ^ *puVar36;
                              uVar50 = 0;
                              if (uVar12 != 0) {
                                for (; (uVar12 >> uVar50 & 1) == 0; uVar50 = uVar50 + 1) {
                                }
                              }
                              uVar17 = ((uint)(uVar50 >> 3) & 0x1fffffff) + iVar15;
                              goto LAB_0011d49b;
                            }
LAB_0011d2e7:
                            if ((puVar37 < local_108) && ((uint)*puVar36 == (uint)*puVar37)) {
                              puVar37 = (ulong *)((long)puVar37 + 4);
                              puVar36 = (ulong *)((long)puVar36 + 4);
                            }
                            if ((puVar37 < local_110) && ((short)*puVar36 == (short)*puVar37)) {
                              puVar37 = (ulong *)((long)puVar37 + 2);
                              puVar36 = (ulong *)((long)puVar36 + 2);
                            }
                            if (puVar37 < puVar10) {
                              puVar37 = (ulong *)((long)puVar37 +
                                                 (ulong)((char)*puVar36 == (char)*puVar37));
                            }
                            uVar17 = (int)puVar37 - (int)local_158;
                          }
LAB_0011d49b:
                          uVar17 = uVar17 + 4;
                          if ((int)uVar46 < (int)uVar17) {
                            uVar46 = uVar17;
                            local_190 = puVar18;
                          }
                        }
                        else {
                          if (*(uint *)(local_e0 + uVar16) != uVar33) {
                            uVar17 = 0;
                            goto LAB_0011d4f5;
                          }
                          puVar18 = (ulong *)((long)puVar19 + (ulong)uVar47);
                          if (puVar10 < puVar18) {
                            puVar18 = puVar10;
                          }
                          puVar36 = (ulong *)(local_e0 + (ulong)uVar16 + 4);
                          puVar37 = (ulong *)((long)puVar18 - 7);
                          puVar44 = local_158;
                          if (local_158 < puVar37) {
                            if (*puVar36 == *local_158) {
                              puVar36 = (ulong *)(local_e0 + (ulong)uVar16 + 0xc);
                              puVar44 = local_128;
                              goto LAB_0011d1f9;
                            }
                            uVar12 = *local_158 ^ *puVar36;
                            uVar50 = 0;
                            if (uVar12 != 0) {
                              for (; (uVar12 >> uVar50 & 1) == 0; uVar50 = uVar50 + 1) {
                              }
                            }
                            uVar43 = (uint)(uVar50 >> 3) & 0x1fffffff;
                          }
                          else {
LAB_0011d1f9:
                            if (puVar44 < puVar37) {
                              iVar15 = (int)local_138 + (int)puVar44;
LAB_0011d20e:
                              if (*puVar36 == *puVar44) goto code_r0x0011d21d;
                              uVar12 = *puVar44 ^ *puVar36;
                              uVar50 = 0;
                              if (uVar12 != 0) {
                                for (; (uVar12 >> uVar50 & 1) == 0; uVar50 = uVar50 + 1) {
                                }
                              }
                              uVar43 = ((uint)(uVar50 >> 3) & 0x1fffffff) + iVar15;
                              local_180 = pLVar20;
                              goto LAB_0011d38e;
                            }
LAB_0011d22e:
                            if ((puVar44 < (ulong *)((long)puVar18 - 3U)) &&
                               ((uint)*puVar36 == (uint)*puVar44)) {
                              puVar44 = (ulong *)((long)puVar44 + 4);
                              puVar36 = (ulong *)((long)puVar36 + 4);
                            }
                            if ((puVar44 < (ulong *)((long)puVar18 - 1U)) &&
                               ((short)*puVar36 == (short)*puVar44)) {
                              puVar44 = (ulong *)((long)puVar44 + 2);
                              puVar36 = (ulong *)((long)puVar36 + 2);
                            }
                            if (puVar44 < puVar18) {
                              puVar44 = (ulong *)((long)puVar44 +
                                                 (ulong)((char)*puVar36 == (char)*puVar44));
                            }
                            uVar43 = (int)puVar44 - (int)local_158;
                            local_180 = pLVar20;
                          }
LAB_0011d38e:
                          uVar17 = uVar43 + 4;
                          if ((puVar18 < puVar10) &&
                             ((ulong *)((long)puVar19 + (long)(int)uVar43 + 4) == puVar18)) {
                            puVar36 = puVar18;
                            puVar37 = local_148;
                            if (puVar18 < puVar35) {
                              if (*local_148 == *puVar18) {
                                puVar36 = puVar18 + 1;
                                puVar37 = local_a8;
                                goto LAB_0011d3ea;
                              }
                              uVar12 = *puVar18 ^ *local_148;
                              uVar50 = 0;
                              if (uVar12 != 0) {
                                for (; (uVar12 >> uVar50 & 1) == 0; uVar50 = uVar50 + 1) {
                                }
                              }
                              uVar47 = (uint)(uVar50 >> 3) & 0x1fffffff;
                            }
                            else {
LAB_0011d3ea:
                              if (puVar36 < puVar35) {
                                puVar44 = (ulong *)((ulong)uVar47 + (long)local_120);
                                if (puVar10 < puVar44) {
                                  puVar44 = puVar10;
                                }
                                iVar15 = (int)puVar36 - (int)puVar44;
LAB_0011d40b:
                                if (*puVar37 == *puVar36) goto code_r0x0011d41a;
                                uVar12 = *puVar36 ^ *puVar37;
                                uVar50 = 0;
                                if (uVar12 != 0) {
                                  for (; (uVar12 >> uVar50 & 1) == 0; uVar50 = uVar50 + 1) {
                                  }
                                }
                                uVar47 = ((uint)(uVar50 >> 3) & 0x1fffffff) + iVar15;
                                goto LAB_0011d4d1;
                              }
LAB_0011d42d:
                              if ((puVar36 < local_108) && ((uint)*puVar37 == (uint)*puVar36)) {
                                puVar36 = (ulong *)((long)puVar36 + 4);
                                puVar37 = (ulong *)((long)puVar37 + 4);
                              }
                              if ((puVar36 < local_110) && ((short)*puVar37 == (short)*puVar36)) {
                                puVar36 = (ulong *)((long)puVar36 + 2);
                                puVar37 = (ulong *)((long)puVar37 + 2);
                              }
                              if (puVar36 < puVar10) {
                                puVar36 = (ulong *)((long)puVar36 +
                                                   (ulong)((char)*puVar37 == (char)*puVar36));
                              }
                              uVar47 = (int)puVar36 - (int)puVar18;
                            }
LAB_0011d4d1:
                            uVar17 = uVar17 + uVar47;
                          }
                          if ((int)uVar46 < (int)uVar17) {
                            uVar46 = uVar17;
                            local_190 = (ulong *)(pLVar3 + uVar16);
                          }
                        }
                      }
                      else {
                        uVar17 = 0;
                      }
LAB_0011d4f5:
                      uVar47 = uVar25 - 1;
                      if (((uVar17 == uVar46) && (uVar46 + uVar16 <= uVar26)) && (3 < (int)uVar17))
                      {
                        iVar41 = 0;
                        iVar15 = 0x10;
                        uVar43 = 1;
                        do {
                          uVar2 = ctx->chainTable[(ushort)((short)iVar41 + (short)uVar16)];
                          iVar42 = iVar15 >> 4;
                          uVar27 = (uint)uVar2;
                          bVar55 = uVar43 < uVar27;
                          iVar15 = iVar15 + 1;
                          if (bVar55) {
                            iVar15 = 0x10;
                          }
                          uVar6 = (uint)uVar2;
                          if (uVar27 < uVar43) {
                            uVar6 = uVar43;
                          }
                          uVar43 = uVar6;
                          if (bVar55) {
                            iVar52 = iVar41;
                          }
                          iVar41 = iVar42 + iVar41;
                        } while (iVar41 < (int)(uVar17 - 3));
                        bVar55 = uVar16 < uVar43;
                        uVar27 = uVar43;
                        if (uVar16 < uVar43) {
                          uVar27 = 0;
                        }
                        if (uVar43 < 2) goto LAB_0011d591;
                        uVar16 = uVar16 - uVar27;
LAB_0011d65d:
                        uVar25 = (uint)pLVar20;
                        uVar46 = uVar17;
LAB_0011d660:
                        if (bVar55) goto LAB_0011e45d;
                      }
                      else {
LAB_0011d591:
                        if ((ctx->chainTable[uVar16 & 0xffff] == 1) && (iVar52 == 0)) {
                          if (iVar48 == 0) {
                            iVar48 = 1;
                            if ((char)local_16c == '\0') goto LAB_0011d6e5;
                            local_1a0 = (ulong *)CONCAT44(local_1a0._4_4_,uVar47);
                            uVar47 = LZ4HC_countPattern((BYTE *)local_158,(BYTE *)puVar10,uVar33);
                            local_c0 = (ulong)uVar47 + 4;
                            iVar48 = 2;
                            uVar47 = (uint)local_1a0;
                          }
                          puVar18 = local_130;
                          if (((iVar48 == 2) && (uVar17 = uVar16 - 1, uVar34 <= uVar17)) &&
                             (iVar48 = 2, uVar17 - uVar7 < 0xfffffffd)) {
                            local_1a0 = (ulong *)CONCAT44(local_1a0._4_4_,uVar47);
                            pLVar21 = local_e0;
                            if (uVar7 <= uVar17) {
                              pLVar21 = pLVar3;
                            }
                            local_180 = pLVar20;
                            if (*(uint *)(pLVar21 + uVar17) == uVar33) {
                              puVar37 = (ulong *)(pLVar21 + uVar17);
                              puVar36 = local_130;
                              if (uVar7 <= uVar17) {
                                puVar36 = puVar10;
                              }
                              uVar16 = LZ4HC_countPattern((BYTE *)((long)puVar37 + 4),
                                                          (BYTE *)puVar36,uVar33);
                              uVar50 = (ulong)uVar16 + 4;
                              puVar36 = local_148;
                              if ((uVar17 < uVar7) &&
                                 (puVar36 = local_140, (ulong *)((long)puVar37 + uVar50) == puVar18)
                                 ) {
                                bVar4 = (char)uVar16 * '\b' & 0x1f;
                                UVar5 = uVar33 << bVar4 | uVar33 >> 0x20 - bVar4;
                                if ((uVar16 & 3) == 0) {
                                  UVar5 = uVar33;
                                }
                                uVar16 = LZ4HC_countPattern((BYTE *)local_148,(BYTE *)puVar10,UVar5)
                                ;
                                puVar36 = local_140;
                                uVar50 = uVar50 + uVar16;
                              }
                              local_100 = uVar50;
                              puVar18 = puVar37;
                              do {
                                puVar44 = puVar18;
                                if (puVar44 < (ulong *)((long)puVar36 + 4U)) break;
                                puVar18 = (ulong *)((long)puVar44 + -4);
                              } while (*(uint *)((long)puVar44 + -4) == uVar33);
                              puVar18 = puVar44;
                              if (puVar36 < puVar44) {
                                lVar9 = 0;
                                do {
                                  if (*(char *)((long)puVar44 + lVar9 + -1) !=
                                      *(char *)((long)&local_1a4 + lVar9 + 3)) {
                                    puVar18 = (ulong *)((long)puVar44 + lVar9);
                                    break;
                                  }
                                  lVar28 = lVar9 + -1;
                                  lVar9 = lVar9 + -1;
                                  puVar18 = puVar36;
                                } while (puVar36 < (ulong *)((long)puVar44 + lVar28));
                              }
                              uVar50 = (long)puVar37 - (long)puVar18;
                              iVar52 = (int)uVar50;
                              local_1a4 = uVar33;
                              if (((uint)local_f0 < uVar7 && uVar7 <= uVar17) &&
                                  (ulong *)((long)puVar37 - (uVar50 & 0xffffffff)) == local_148) {
                                bVar4 = (char)uVar50 * -8 & 0x1f;
                                puVar18 = local_130;
                                local_1a4 = uVar33 << bVar4 | uVar33 >> 0x20 - bVar4;
                                if ((-iVar52 & 3U) == 0) {
                                  local_1a4 = uVar33;
                                }
                                do {
                                  puVar36 = puVar18;
                                  if (puVar36 < local_a0) break;
                                  puVar18 = (ulong *)((long)puVar36 + -4);
                                } while (*(uint *)((long)puVar36 + -4) == local_1a4);
                                puVar18 = puVar36;
                                if (local_140 < puVar36) {
                                  lVar9 = 0;
                                  do {
                                    if (*(char *)((long)puVar36 + lVar9 + -1) !=
                                        *(char *)((long)&local_1a4 + lVar9 + 3)) {
                                      puVar18 = (ulong *)((long)puVar36 + lVar9);
                                      break;
                                    }
                                    lVar28 = lVar9 + -1;
                                    lVar9 = lVar9 + -1;
                                    puVar18 = local_140;
                                  } while (local_140 < (ulong *)((long)puVar36 + lVar28));
                                }
                                iVar52 = ((int)local_130 - (int)puVar18) + iVar52;
                              }
                              uVar25 = (uint)local_180;
                              uVar43 = uVar17 - iVar52;
                              if (uVar17 - iVar52 <= uVar34) {
                                uVar43 = uVar34;
                              }
                              uVar50 = (uVar17 - uVar43) + local_100;
                              uVar47 = (uint)local_1a0;
                              if ((local_100 <= local_c0) && (local_c0 <= uVar50)) {
                                uVar16 = (uVar17 - (int)local_c0) + (int)local_100;
                                if (0xfffffffc < uVar16 - uVar7) {
                                  uVar16 = uVar7;
                                }
                                iVar52 = 0;
                                iVar48 = 2;
                                goto LAB_0011d6f8;
                              }
                              bVar55 = false;
                              iVar48 = 2;
                              if (0xfffffffc < uVar43 - uVar7) {
                                iVar52 = 0;
                                pLVar20 = local_180;
                                uVar17 = uVar46;
                                uVar16 = uVar7;
                                goto LAB_0011d65d;
                              }
                              if (local_c0 <= uVar50) {
                                uVar50 = local_c0;
                              }
                              if ((ulong)(long)(int)uVar46 < uVar50) {
                                if (0xffff < ((long)puVar19 - (long)pLVar3) - (ulong)uVar43)
                                goto LAB_0011e45d;
                                local_190 = (ulong *)(pLVar3 + uVar43);
                                uVar46 = (uint)uVar50;
                              }
                              bVar55 = false;
                              iVar52 = 0;
                              uVar16 = uVar43 - ctx->chainTable[(ulong)uVar43 & 0xffff];
                              if (ctx->chainTable[(ulong)uVar43 & 0xffff] <= uVar43)
                              goto LAB_0011d660;
                              goto LAB_0011e45d;
                            }
                          }
                        }
LAB_0011d6e5:
                        uVar16 = uVar16 - ctx->chainTable[(ushort)((short)uVar16 + (short)iVar52)];
                      }
LAB_0011d6f8:
                      if ((uVar16 < uVar34) || (bVar55 = (int)uVar25 < 2, uVar25 = uVar47, bVar55))
                      goto LAB_0011e45d;
                    } while( true );
                  }
                  uVar46 = 3;
                  local_190 = (ulong *)0x0;
                  uVar47 = local_114;
                  local_178 = puVar36;
                  local_120 = puVar18;
                  local_f8 = piVar29;
                  local_80 = pvVar1;
LAB_0011e45d:
                  if (((dict == usingDictCtxHc) && (0 < (int)uVar47)) && (uVar26 - uVar34 < 0xffff))
                  {
                    pLVar20 = local_e8->base;
                    puVar18 = (ulong *)(local_e8->end + -(long)pLVar20);
                    uVar16 = local_e8->hashTable[(uint)*puVar19 * -0x61c8864f >> 0x11];
                    uVar34 = (uVar34 + uVar16) - (int)puVar18;
                    while ((uVar26 - uVar34 < 0x10000 &&
                           (bVar55 = uVar47 != 0, uVar47 = uVar47 - 1, local_1a0 = puVar18,
                           local_180 = pLVar20, bVar55))) {
                      uVar50 = (ulong)uVar16;
                      if (*(uint *)(pLVar20 + uVar50) == uVar33) {
                        puVar36 = (ulong *)(((long)puVar18 - uVar50) + (long)puVar19);
                        if (puVar10 < puVar36) {
                          puVar36 = puVar10;
                        }
                        puVar37 = (ulong *)(pLVar20 + uVar50 + 4);
                        puVar44 = (ulong *)((long)puVar36 - 7);
                        puVar30 = local_158;
                        if (local_158 < puVar44) {
                          if (*puVar37 == *local_158) {
                            puVar37 = (ulong *)(pLVar20 + uVar50 + 0xc);
                            puVar30 = local_128;
                            goto LAB_0011e551;
                          }
                          uVar12 = *local_158 ^ *puVar37;
                          uVar50 = 0;
                          if (uVar12 != 0) {
                            for (; (uVar12 >> uVar50 & 1) == 0; uVar50 = uVar50 + 1) {
                            }
                          }
                          uVar25 = (uint)(uVar50 >> 3) & 0x1fffffff;
                        }
                        else {
LAB_0011e551:
                          if (puVar30 < puVar44) {
                            iVar52 = (int)local_138 + (int)puVar30;
LAB_0011e561:
                            if (*puVar37 == *puVar30) goto code_r0x0011e56c;
                            uVar12 = *puVar30 ^ *puVar37;
                            uVar50 = 0;
                            if (uVar12 != 0) {
                              for (; (uVar12 >> uVar50 & 1) == 0; uVar50 = uVar50 + 1) {
                              }
                            }
                            uVar25 = ((uint)(uVar50 >> 3) & 0x1fffffff) + iVar52;
                            goto LAB_0011e5ef;
                          }
LAB_0011e57d:
                          if ((puVar30 < (ulong *)((long)puVar36 - 3U)) &&
                             ((uint)*puVar37 == (uint)*puVar30)) {
                            puVar30 = (ulong *)((long)puVar30 + 4);
                            puVar37 = (ulong *)((long)puVar37 + 4);
                          }
                          if ((puVar30 < (ulong *)((long)puVar36 - 1U)) &&
                             ((short)*puVar37 == (short)*puVar30)) {
                            puVar30 = (ulong *)((long)puVar30 + 2);
                            puVar37 = (ulong *)((long)puVar37 + 2);
                          }
                          if (puVar30 < puVar36) {
                            puVar30 = (ulong *)((long)puVar30 +
                                               (ulong)((char)*puVar37 == (char)*puVar30));
                          }
                          uVar25 = (int)puVar30 - (int)local_158;
                        }
LAB_0011e5ef:
                        if ((int)uVar46 < (int)(uVar25 + 4)) {
                          local_190 = (ulong *)(pLVar3 + uVar34);
                          uVar46 = uVar25 + 4;
                        }
                      }
                      uVar25 = uVar16 & 0xffff;
                      uVar16 = uVar16 - local_e8->chainTable[uVar25];
                      uVar34 = uVar34 - local_e8->chainTable[uVar25];
                    }
                  }
                  puVar18 = local_120;
                  piVar29 = local_f8;
                  uVar50 = local_188;
                  pvVar8 = local_160;
                  puVar36 = local_178;
                  if (3 < (int)uVar46) {
                    uVar12 = (ulong)uVar46;
                    if (uVar46 - 0x13 < 0x12) {
                      uVar12 = 0x12;
                    }
                    if (favorDecSpeed == favorCompressionRatio) {
                      uVar12 = (ulong)uVar46;
                    }
LAB_0011e922:
                    uVar38 = (long)puVar19 - (long)local_190;
                    iVar48 = (int)uVar12;
                    iVar52 = (int)local_178;
                    pvVar8 = local_160;
                    if ((local_88 < (ulong)(long)iVar48) || (0xfff < iVar48 + iVar52)) {
                      uVar50 = (ulong)(iVar52 + 1);
                      puVar18 = local_178;
                      goto LAB_0011ec87;
                    }
                    iVar15 = *(int *)((long)local_160 + local_38 + 0xc);
                    lVar9 = (long)iVar15;
                    iVar32 = iVar15 + 1 + (iVar15 - 0xfU) / 0xff;
                    iVar41 = *(int *)((long)local_160 + local_38);
                    iVar42 = iVar15;
                    if (0xe < lVar9) {
                      iVar42 = iVar32;
                    }
                    uVar26 = iVar15 - 0xe;
                    iVar40 = 1;
                    lVar28 = 0;
                    piVar29 = local_78;
                    do {
                      if (lVar9 + 1 + lVar28 < 0xf) {
                        iVar49 = iVar40 + iVar15;
                      }
                      else {
                        iVar49 = uVar26 / 0xff + iVar15 + 2 + (int)lVar28;
                      }
                      iVar49 = iVar49 + (iVar41 - iVar42);
                      if (iVar49 < *piVar29) {
                        piVar29[1] = 0;
                        piVar29[2] = 1;
                        piVar29[3] = iVar15 + (int)lVar28 + 1;
                        *piVar29 = iVar49;
                      }
                      iVar40 = iVar40 + 1;
                      piVar29 = piVar29 + 4;
                      uVar26 = uVar26 + 1;
                      lVar28 = lVar28 + 1;
                    } while (lVar28 != 3);
                    uVar50 = local_188;
                    if (3 < iVar48) {
                      iVar42 = iVar15;
                      if (0xe < iVar15) {
                        iVar42 = iVar32;
                      }
                      iVar32 = *(int *)((long)local_80 + 8);
                      uVar45 = 4;
                      piVar29 = local_f8;
                      do {
                        iVar40 = (int)uVar45;
                        if (iVar32 == 1) {
                          iVar22 = 0;
                          if (lVar9 < (long)local_178) {
                            iVar22 = *(int *)((long)(iVar52 - iVar15) * 0x10 + (long)local_160);
                          }
                          iVar49 = iVar42 + 3;
                          if (0x12 < uVar45) {
                            iVar49 = (iVar40 - 0x13U) / 0xff + iVar42 + 3 + 1;
                          }
                          iVar49 = iVar49 + iVar22;
                          iVar22 = iVar15;
                        }
                        else {
                          iVar49 = 3;
                          if (0x12 < uVar45) {
                            iVar49 = (iVar40 - 0x13U) / 0xff + 4;
                          }
                          iVar49 = iVar49 + iVar41;
                          iVar22 = 0;
                        }
                        uVar53 = (local_1b8 + uVar45) - 4;
                        iVar51 = (int)uVar53;
                        if (((int)uVar50 + 3 < iVar51) ||
                           (iVar49 <= (int)(*piVar29 - favorDecSpeed))) {
                          if (iVar51 < (int)uVar50) {
                            uVar53 = uVar50;
                          }
                          if (uVar12 != uVar45) {
                            uVar53 = uVar50;
                          }
                          uVar50 = uVar53 & 0xffffffff;
                          piVar29[2] = iVar40;
                          piVar29[1] = (int)uVar38;
                          piVar29[3] = iVar22;
                          *piVar29 = iVar49;
                        }
                        uVar45 = uVar45 + 1;
                        piVar29 = piVar29 + 4;
                      } while (iVar48 + 1 != uVar45);
                    }
                    lVar9 = (long)(int)uVar50 * 0x10;
                    lVar28 = lVar9 + local_90;
                    iVar52 = 1;
                    lVar31 = 0;
                    do {
                      *(undefined8 *)(lVar28 + -8 + lVar31) = 0x100000000;
                      *(int *)(lVar28 + lVar31) = iVar52;
                      *(int *)(lVar28 + -0xc + lVar31) = *(int *)(lVar9 + (long)local_160) + iVar52;
                      lVar31 = lVar31 + 0x10;
                      iVar52 = iVar52 + 1;
                      puVar18 = local_120;
                      piVar29 = local_f8;
                      puVar36 = local_178;
                    } while (lVar31 != 0x30);
                  }
                }
                puVar36 = (ulong *)((long)puVar36 + 1);
                local_168 = (uint *)(ulong)((int)local_168 + 1);
                local_138 = (ulong)((int)local_138 - 1);
                local_78 = local_78 + 4;
                piVar29 = piVar29 + 4;
                local_1b8 = local_1b8 + 1;
              } while ((long)puVar36 < (long)(int)uVar50);
            }
            lVar9 = (long)(int)uVar50 * 0x10;
            uVar38 = (ulong)*(uint *)((long)pvVar8 + lVar9 + 4);
            uVar26 = *(uint *)((long)pvVar8 + lVar9 + 8);
            uVar12 = (ulong)uVar26;
            puVar18 = (ulong *)(ulong)((int)uVar50 - uVar26);
LAB_0011ec87:
            do {
              iVar52 = (int)puVar18;
              lVar9 = (long)iVar52 * 0x10;
              uVar26 = *(uint *)((long)pvVar8 + lVar9 + 4);
              uVar34 = *(uint *)((long)pvVar8 + lVar9 + 8);
              *(int *)((long)pvVar8 + lVar9 + 8) = (int)uVar12;
              *(int *)((long)pvVar8 + lVar9 + 4) = (int)uVar38;
              uVar12 = (ulong)uVar34;
              uVar38 = (ulong)uVar26;
              puVar18 = (ulong *)(ulong)(iVar52 - uVar34);
            } while ((int)uVar34 <= iVar52);
            source = (char *)local_198;
            dst = local_150;
            if (0 < (int)uVar50) {
              iVar48 = 0;
              local_188 = uVar50;
              do {
                uVar26 = *(uint *)((long)pvVar8 + (long)iVar48 * 0x10 + 8);
                lVar9 = (long)(int)uVar26;
                if (lVar9 == 1) {
                  iVar48 = iVar48 + 1;
                  local_1c8 = (ulong *)((long)local_1c8 + 1);
                }
                else {
                  uVar50 = (long)local_1c8 - (long)source;
                  iVar52 = *(int *)((long)pvVar8 + (long)iVar48 * 0x10 + 4);
                  uVar39 = (undefined2)iVar52;
                  local_198 = (ulong *)source;
                  if ((limit != notLimited) && (local_d0 < dst + uVar50 + uVar50 / 0xff + 9))
                  goto LAB_0011f05f;
                  puVar18 = (ulong *)(dst + 1);
                  if (uVar50 < 0xf) {
                    *dst = (char)uVar50 << 4;
                  }
                  else {
                    uVar11 = uVar50 - 0xf;
                    *dst = -0x10;
                    if (0xfe < uVar11) {
                      uVar11 = (uVar50 - 0x10e) / 0xff;
                      local_150 = dst;
                      memset(puVar18,0xff,uVar11 + 1);
                      puVar18 = (ulong *)(local_150 + uVar11 + 2);
                      uVar11 = (uVar50 + uVar11 * -0xff) - 0x10e;
                      dst = local_150;
                    }
                    *(char *)puVar18 = (char)uVar11;
                    puVar18 = (ulong *)((long)puVar18 + 1);
                  }
                  iVar48 = iVar48 + uVar26;
                  puVar37 = (ulong *)(uVar50 + (long)puVar18);
                  puVar36 = local_198;
                  puVar19 = puVar18;
                  do {
                    *puVar19 = *puVar36;
                    puVar19 = puVar19 + 1;
                    puVar36 = puVar36 + 1;
                  } while (puVar19 < puVar37);
                  uVar50 = lVar9 - 4;
                  *(undefined2 *)puVar37 = uVar39;
                  if ((limit != notLimited) &&
                     (local_d0 < (char *)((long)puVar37 + uVar50 / 0xff + 8))) {
                    uVar50 = (ulong)uVar26;
                    local_150 = dst;
                    goto LAB_0011f057;
                  }
                  pcVar23 = (char *)((long)puVar37 + 2);
                  if (uVar50 < 0xf) {
                    *dst = *dst + (char)uVar50;
                    dst = pcVar23;
                  }
                  else {
                    *dst = *dst + '\x0f';
                    uVar50 = lVar9 - 0x13;
                    if (0x1fd < uVar50) {
                      uVar50 = (lVar9 - 0x211U) / 0x1fe;
                      memset(pcVar23,0xff,uVar50 * 2 + 2);
                      pcVar23 = (char *)((long)puVar18 +
                                        (long)local_1c8 + (uVar50 * 2 - (long)local_198) + 4);
                      uVar50 = (uVar50 * -0x1fe + lVar9) - 0x211;
                    }
                    if (0xfe < uVar50) {
                      uVar50 = uVar50 - 0xff;
                      *pcVar23 = -1;
                      pcVar23 = pcVar23 + 1;
                    }
                    *pcVar23 = (char)uVar50;
                    dst = pcVar23 + 1;
                  }
                  source = (char *)((long)local_1c8 + lVar9);
                  pvVar8 = local_160;
                  local_1c8 = (ulong *)source;
                }
              } while (iVar48 < (int)local_188);
            }
            goto LAB_0011eff7;
          }
          if ((limit == notLimited) || (local_150 + uVar12 + uVar12 / 0xff + 9 <= local_d0)) {
            puVar18 = (ulong *)(local_150 + 1);
            if (uVar12 < 0xf) {
              *local_150 = (char)uVar12 << 4;
            }
            else {
              uVar11 = uVar12 - 0xf;
              *local_150 = -0x10;
              if (0xfe < uVar11) {
                uVar11 = (uVar12 - 0x10e) / 0xff;
                memset(puVar18,0xff,uVar11 + 1);
                puVar18 = (ulong *)(local_150 + uVar11 + 2);
                uVar11 = (uVar12 + uVar11 * -0xff) - 0x10e;
              }
              *(char *)puVar18 = (char)uVar11;
              puVar18 = (ulong *)((long)puVar18 + 1);
            }
            puVar37 = (ulong *)(uVar12 + (long)puVar18);
            puVar36 = local_198;
            puVar19 = puVar18;
            do {
              *puVar19 = *puVar36;
              puVar19 = puVar19 + 1;
              puVar36 = puVar36 + 1;
            } while (puVar19 < puVar37);
            uVar11 = uVar50 - 4;
            *(short *)puVar37 = (short)lVar9;
            if ((limit == notLimited) || ((char *)((long)puVar37 + uVar11 / 0xff + 8) <= local_d0))
            {
              dst = (char *)((long)puVar37 + 2);
              if (uVar11 < 0xf) {
                *local_150 = *local_150 + (char)uVar11;
              }
              else {
                *local_150 = *local_150 + '\x0f';
                uVar11 = uVar50 - 0x13;
                if (0x1fd < uVar11) {
                  uVar11 = (uVar50 - 0x211) / 0x1fe;
                  memset(dst,0xff,uVar11 * 2 + 2);
                  dst = (char *)((long)puVar18 +
                                (long)local_1c8 + (uVar11 * 2 - (long)local_198) + 4);
                  uVar11 = (uVar11 * -0x1fe + uVar50) - 0x211;
                }
                if (0xfe < uVar11) {
                  uVar11 = uVar11 - 0xff;
                  *dst = -1;
                  dst = dst + 1;
                }
                *dst = (char)uVar11;
                dst = dst + 1;
              }
              local_1c8 = (ulong *)((long)local_1c8 + uVar50);
              source = (char *)local_1c8;
              pvVar8 = local_160;
              goto LAB_0011eff7;
            }
          }
LAB_0011f057:
          uVar39 = (undefined2)iVar52;
          uVar26 = (uint)uVar50;
          pvVar8 = local_160;
          dst = local_150;
LAB_0011f05f:
          local_150 = dst;
          iVar52 = 0;
          if (limit != fillOutput) goto LAB_0011f289;
          uVar50 = (long)local_1c8 - (long)local_198;
          pcVar23 = local_150 + (uVar50 + 0xf0) / 0xff + uVar50 + 1;
          if (pcVar23 <= local_58 + -8) {
            uVar11 = ((long)(local_58 + -8) - (long)pcVar23) * 0xff + 0x12;
            if (uVar11 < (ulong)(long)(int)uVar26) {
              uVar26 = (uint)uVar11;
            }
            lVar9 = (long)(int)uVar26;
            if (-0xd < (long)(pcVar23 + (2 - (long)(local_58 + lVar9)))) goto LAB_0011f172;
            puVar35 = (ulong *)(local_150 + 1);
            if (uVar50 < 0xf) {
              *local_150 = (char)uVar50 << 4;
            }
            else {
              uVar11 = uVar50 - 0xf;
              *local_150 = -0x10;
              if (0xfe < uVar11) {
                uVar11 = (uVar50 - 0x10e) / 0xff;
                memset(puVar35,0xff,uVar11 + 1);
                puVar35 = (ulong *)(local_150 + uVar11 + 2);
                uVar11 = (uVar50 + uVar11 * -0xff) - 0x10e;
                pvVar8 = local_160;
              }
              *(char *)puVar35 = (char)uVar11;
              puVar35 = (ulong *)((long)puVar35 + 1);
            }
            puVar36 = (ulong *)(uVar50 + (long)puVar35);
            puVar10 = local_198;
            puVar18 = puVar35;
            do {
              *puVar18 = *puVar10;
              puVar18 = puVar18 + 1;
              puVar10 = puVar10 + 1;
            } while (puVar18 < puVar36);
            *(undefined2 *)puVar36 = uVar39;
            dst = (char *)((long)puVar36 + 2);
            if (lVar9 - 4U < 0xf) {
              *local_150 = *local_150 + (char)(lVar9 - 4U);
            }
            else {
              *local_150 = *local_150 + '\x0f';
              uVar50 = lVar9 - 0x13;
              if (0x1fd < uVar50) {
                uVar50 = (lVar9 - 0x211U) / 0x1fe;
                memset(dst,0xff,uVar50 * 2 + 2);
                dst = (char *)((long)puVar35 + (long)local_1c8 + (uVar50 * 2 - (long)local_198) + 4)
                ;
                uVar50 = (uVar50 * -0x1fe + lVar9) - 0x211;
                pvVar8 = local_160;
              }
              if (0xfe < uVar50) {
                uVar50 = uVar50 - 0xff;
                *dst = -1;
                dst = dst + 1;
              }
              *dst = (char)uVar50;
              dst = dst + 1;
            }
            source = (char *)((long)local_1c8 + lVar9);
            break;
          }
LAB_0011f172:
          __n = local_b0 + -(long)local_198;
          iVar48 = (int)local_d8;
          pcVar23 = local_58;
          source = (char *)local_198;
          if (local_150 + (long)(__n + (ulong)(__n + 0xf0) / 0xff + 1) <= local_58)
          goto LAB_0011f1cc;
          goto LAB_0011f1ad;
        }
        local_1c8 = (ulong *)((long)local_1c8 + 1);
        source = (char *)local_198;
        dst = local_150;
LAB_0011eff7:
      } while (local_1c8 <= puVar35);
    }
    __n = local_b0 + -(long)source;
    iVar48 = (int)local_d8;
    local_150 = dst;
    if ((limit != notLimited) &&
       (local_d0 + (ulong)(limit == fillOutput) * 5 <
        dst + (long)(__n + (ulong)(__n + 0xf0) / 0xff + 1))) {
      iVar52 = 0;
      pcVar23 = local_d0 + (ulong)(limit == fillOutput) * 5;
      if (limit == limitedOutput) goto LAB_0011f289;
LAB_0011f1ad:
      __n = pcVar23 + (~(ulong)local_150 - ((ulong)(pcVar23 + ~(ulong)local_150 + 0xf1) >> 8));
    }
LAB_0011f1cc:
    pcVar24 = local_150;
    iVar52 = (int)source;
    pcVar23 = local_150 + 1;
    if (__n < (char *)0xf) {
      *local_150 = (char)__n << 4;
    }
    else {
      pcVar14 = __n + -0xf;
      *local_150 = -0x10;
      pcVar54 = pcVar23;
      if ((char *)0xfe < pcVar14) {
        uVar50 = (ulong)(__n + -0x10e) / 0xff;
        local_198 = (ulong *)source;
        memset(pcVar23,0xff,uVar50 + 1);
        pcVar54 = pcVar24 + uVar50 + 2;
        pcVar24 = pcVar24 + uVar50 + 1;
        iVar48 = (int)local_d8;
        pcVar14 = __n + uVar50 * -0xff + -0x10e;
        source = (char *)local_198;
      }
      pcVar23 = pcVar24 + 2;
      *pcVar54 = (char)pcVar14;
    }
    memcpy(pcVar23,source,(size_t)__n);
    *local_40 = (iVar52 + (int)__n) - (int)local_48;
    iVar52 = ((int)pcVar23 + (int)__n) - iVar48;
  }
LAB_0011f289:
  free(pvVar8);
  return iVar52;
code_r0x0011c333:
  puVar36 = puVar36 + 1;
  puVar18 = puVar18 + 1;
  iVar15 = iVar15 + 8;
  if (puVar35 <= puVar36) goto LAB_0011c343;
  goto LAB_0011c324;
code_r0x0011c272:
  puVar44 = puVar44 + 1;
  puVar19 = puVar19 + 1;
  iVar15 = iVar15 + 8;
  if (puVar37 <= puVar44) goto LAB_0011c283;
  goto LAB_0011c263;
code_r0x0011c495:
  puVar19 = puVar19 + 1;
  puVar37 = puVar37 + 1;
  iVar15 = iVar15 + 8;
  if (puVar35 <= puVar19) goto LAB_0011c4a6;
  goto LAB_0011c486;
code_r0x0011cc03:
  puVar37 = puVar37 + 1;
  puVar36 = puVar36 + 1;
  iVar52 = iVar52 + 8;
  if (puVar19 <= puVar37) goto LAB_0011cc14;
  goto LAB_0011cbf4;
code_r0x0011dcb5:
  puVar30 = puVar30 + 1;
  puVar36 = puVar36 + 1;
  iVar41 = iVar41 + 8;
  if (puVar35 <= puVar30) goto LAB_0011dcc7;
  goto LAB_0011dca6;
code_r0x0011dc05:
  puVar37 = puVar37 + 1;
  puVar36 = puVar36 + 1;
  iVar41 = iVar41 + 8;
  if (puVar30 <= puVar37) goto LAB_0011dc16;
  goto LAB_0011dbf6;
code_r0x0011ddfb:
  puVar36 = puVar36 + 1;
  puVar30 = puVar30 + 1;
  iVar41 = iVar41 + 8;
  if (puVar35 <= puVar36) goto LAB_0011de0e;
  goto LAB_0011ddec;
code_r0x0011e7d0:
  puVar37 = puVar37 + 1;
  puVar36 = puVar36 + 1;
  iVar52 = iVar52 + 8;
  if (puVar44 <= puVar37) goto LAB_0011e7e1;
  goto LAB_0011e7c5;
code_r0x0011d2d5:
  puVar37 = puVar37 + 1;
  puVar36 = puVar36 + 1;
  iVar15 = iVar15 + 8;
  if (puVar35 <= puVar37) goto LAB_0011d2e7;
  goto LAB_0011d2c6;
code_r0x0011d21d:
  puVar44 = puVar44 + 1;
  puVar36 = puVar36 + 1;
  iVar15 = iVar15 + 8;
  if (puVar37 <= puVar44) goto LAB_0011d22e;
  goto LAB_0011d20e;
code_r0x0011d41a:
  puVar36 = puVar36 + 1;
  puVar37 = puVar37 + 1;
  iVar15 = iVar15 + 8;
  if (puVar35 <= puVar36) goto LAB_0011d42d;
  goto LAB_0011d40b;
code_r0x0011e56c:
  puVar30 = puVar30 + 1;
  puVar37 = puVar37 + 1;
  iVar52 = iVar52 + 8;
  if (puVar44 <= puVar30) goto LAB_0011e57d;
  goto LAB_0011e561;
}

Assistant:

static int LZ4HC_compress_optimal ( LZ4HC_CCtx_internal* ctx,
                                    const char* const source,
                                    char* dst,
                                    int* srcSizePtr,
                                    int dstCapacity,
                                    int const nbSearches,
                                    size_t sufficient_len,
                                    const limitedOutput_directive limit,
                                    int const fullUpdate,
                                    const dictCtx_directive dict,
                                    const HCfavor_e favorDecSpeed)
{
    int retval = 0;
#define TRAILING_LITERALS 3
#ifdef LZ4HC_HEAPMODE
    LZ4HC_optimal_t* const opt = (LZ4HC_optimal_t*)ALLOC(sizeof(LZ4HC_optimal_t) * (LZ4_OPT_NUM + TRAILING_LITERALS));
#else
    LZ4HC_optimal_t opt[LZ4_OPT_NUM + TRAILING_LITERALS];   /* ~64 KB, which is a bit large for stack... */
#endif

    const BYTE* ip = (const BYTE*) source;
    const BYTE* anchor = ip;
    const BYTE* const iend = ip + *srcSizePtr;
    const BYTE* const mflimit = iend - MFLIMIT;
    const BYTE* const matchlimit = iend - LASTLITERALS;
    BYTE* op = (BYTE*) dst;
    BYTE* opSaved = (BYTE*) dst;
    BYTE* oend = op + dstCapacity;
    int ovml = MINMATCH;  /* overflow - last sequence */
    const BYTE* ovref = NULL;

    /* init */
#ifdef LZ4HC_HEAPMODE
    if (opt == NULL) goto _return_label;
#endif
    DEBUGLOG(5, "LZ4HC_compress_optimal(dst=%p, dstCapa=%u)", dst, (unsigned)dstCapacity);
    *srcSizePtr = 0;
    if (limit == fillOutput) oend -= LASTLITERALS;   /* Hack for support LZ4 format restriction */
    if (sufficient_len >= LZ4_OPT_NUM) sufficient_len = LZ4_OPT_NUM-1;

    /* Main Loop */
    while (ip <= mflimit) {
         int const llen = (int)(ip - anchor);
         int best_mlen, best_off;
         int cur, last_match_pos = 0;

         LZ4HC_match_t const firstMatch = LZ4HC_FindLongerMatch(ctx, ip, matchlimit, MINMATCH-1, nbSearches, dict, favorDecSpeed);
         if (firstMatch.len==0) { ip++; continue; }

         if ((size_t)firstMatch.len > sufficient_len) {
             /* good enough solution : immediate encoding */
             int const firstML = firstMatch.len;
             const BYTE* const matchPos = ip - firstMatch.off;
             opSaved = op;
             if ( LZ4HC_encodeSequence(UPDATABLE(ip, op, anchor), firstML, matchPos, limit, oend) ) {  /* updates ip, op and anchor */
                 ovml = firstML;
                 ovref = matchPos;
                 goto _dest_overflow;
             }
             continue;
         }

         /* set prices for first positions (literals) */
         {   int rPos;
             for (rPos = 0 ; rPos < MINMATCH ; rPos++) {
                 int const cost = LZ4HC_literalsPrice(llen + rPos);
                 opt[rPos].mlen = 1;
                 opt[rPos].off = 0;
                 opt[rPos].litlen = llen + rPos;
                 opt[rPos].price = cost;
                 DEBUGLOG(7, "rPos:%3i => price:%3i (litlen=%i) -- initial setup",
                             rPos, cost, opt[rPos].litlen);
         }   }
         /* set prices using initial match */
         {   int mlen = MINMATCH;
             int const matchML = firstMatch.len;   /* necessarily < sufficient_len < LZ4_OPT_NUM */
             int const offset = firstMatch.off;
             assert(matchML < LZ4_OPT_NUM);
             for ( ; mlen <= matchML ; mlen++) {
                 int const cost = LZ4HC_sequencePrice(llen, mlen);
                 opt[mlen].mlen = mlen;
                 opt[mlen].off = offset;
                 opt[mlen].litlen = llen;
                 opt[mlen].price = cost;
                 DEBUGLOG(7, "rPos:%3i => price:%3i (matchlen=%i) -- initial setup",
                             mlen, cost, mlen);
         }   }
         last_match_pos = firstMatch.len;
         {   int addLit;
             for (addLit = 1; addLit <= TRAILING_LITERALS; addLit ++) {
                 opt[last_match_pos+addLit].mlen = 1; /* literal */
                 opt[last_match_pos+addLit].off = 0;
                 opt[last_match_pos+addLit].litlen = addLit;
                 opt[last_match_pos+addLit].price = opt[last_match_pos].price + LZ4HC_literalsPrice(addLit);
                 DEBUGLOG(7, "rPos:%3i => price:%3i (litlen=%i) -- initial setup",
                             last_match_pos+addLit, opt[last_match_pos+addLit].price, addLit);
         }   }

         /* check further positions */
         for (cur = 1; cur < last_match_pos; cur++) {
             const BYTE* const curPtr = ip + cur;
             LZ4HC_match_t newMatch;

             if (curPtr > mflimit) break;
             DEBUGLOG(7, "rPos:%u[%u] vs [%u]%u",
                     cur, opt[cur].price, opt[cur+1].price, cur+1);
             if (fullUpdate) {
                 /* not useful to search here if next position has same (or lower) cost */
                 if ( (opt[cur+1].price <= opt[cur].price)
                   /* in some cases, next position has same cost, but cost rises sharply after, so a small match would still be beneficial */
                   && (opt[cur+MINMATCH].price < opt[cur].price + 3/*min seq price*/) )
                     continue;
             } else {
                 /* not useful to search here if next position has same (or lower) cost */
                 if (opt[cur+1].price <= opt[cur].price) continue;
             }

             DEBUGLOG(7, "search at rPos:%u", cur);
             if (fullUpdate)
                 newMatch = LZ4HC_FindLongerMatch(ctx, curPtr, matchlimit, MINMATCH-1, nbSearches, dict, favorDecSpeed);
             else
                 /* only test matches of minimum length; slightly faster, but misses a few bytes */
                 newMatch = LZ4HC_FindLongerMatch(ctx, curPtr, matchlimit, last_match_pos - cur, nbSearches, dict, favorDecSpeed);
             if (!newMatch.len) continue;

             if ( ((size_t)newMatch.len > sufficient_len)
               || (newMatch.len + cur >= LZ4_OPT_NUM) ) {
                 /* immediate encoding */
                 best_mlen = newMatch.len;
                 best_off = newMatch.off;
                 last_match_pos = cur + 1;
                 goto encode;
             }

             /* before match : set price with literals at beginning */
             {   int const baseLitlen = opt[cur].litlen;
                 int litlen;
                 for (litlen = 1; litlen < MINMATCH; litlen++) {
                     int const price = opt[cur].price - LZ4HC_literalsPrice(baseLitlen) + LZ4HC_literalsPrice(baseLitlen+litlen);
                     int const pos = cur + litlen;
                     if (price < opt[pos].price) {
                         opt[pos].mlen = 1; /* literal */
                         opt[pos].off = 0;
                         opt[pos].litlen = baseLitlen+litlen;
                         opt[pos].price = price;
                         DEBUGLOG(7, "rPos:%3i => price:%3i (litlen=%i)",
                                     pos, price, opt[pos].litlen);
             }   }   }

             /* set prices using match at position = cur */
             {   int const matchML = newMatch.len;
                 int ml = MINMATCH;

                 assert(cur + newMatch.len < LZ4_OPT_NUM);
                 for ( ; ml <= matchML ; ml++) {
                     int const pos = cur + ml;
                     int const offset = newMatch.off;
                     int price;
                     int ll;
                     DEBUGLOG(7, "testing price rPos %i (last_match_pos=%i)",
                                 pos, last_match_pos);
                     if (opt[cur].mlen == 1) {
                         ll = opt[cur].litlen;
                         price = ((cur > ll) ? opt[cur - ll].price : 0)
                               + LZ4HC_sequencePrice(ll, ml);
                     } else {
                         ll = 0;
                         price = opt[cur].price + LZ4HC_sequencePrice(0, ml);
                     }

                    assert((U32)favorDecSpeed <= 1);
                     if (pos > last_match_pos+TRAILING_LITERALS
                      || price <= opt[pos].price - (int)favorDecSpeed) {
                         DEBUGLOG(7, "rPos:%3i => price:%3i (matchlen=%i)",
                                     pos, price, ml);
                         assert(pos < LZ4_OPT_NUM);
                         if ( (ml == matchML)  /* last pos of last match */
                           && (last_match_pos < pos) )
                             last_match_pos = pos;
                         opt[pos].mlen = ml;
                         opt[pos].off = offset;
                         opt[pos].litlen = ll;
                         opt[pos].price = price;
             }   }   }
             /* complete following positions with literals */
             {   int addLit;
                 for (addLit = 1; addLit <= TRAILING_LITERALS; addLit ++) {
                     opt[last_match_pos+addLit].mlen = 1; /* literal */
                     opt[last_match_pos+addLit].off = 0;
                     opt[last_match_pos+addLit].litlen = addLit;
                     opt[last_match_pos+addLit].price = opt[last_match_pos].price + LZ4HC_literalsPrice(addLit);
                     DEBUGLOG(7, "rPos:%3i => price:%3i (litlen=%i)", last_match_pos+addLit, opt[last_match_pos+addLit].price, addLit);
             }   }
         }  /* for (cur = 1; cur <= last_match_pos; cur++) */

         assert(last_match_pos < LZ4_OPT_NUM + TRAILING_LITERALS);
         best_mlen = opt[last_match_pos].mlen;
         best_off = opt[last_match_pos].off;
         cur = last_match_pos - best_mlen;

encode: /* cur, last_match_pos, best_mlen, best_off must be set */
         assert(cur < LZ4_OPT_NUM);
         assert(last_match_pos >= 1);  /* == 1 when only one candidate */
         DEBUGLOG(6, "reverse traversal, looking for shortest path (last_match_pos=%i)", last_match_pos);
         {   int candidate_pos = cur;
             int selected_matchLength = best_mlen;
             int selected_offset = best_off;
             while (1) {  /* from end to beginning */
                 int const next_matchLength = opt[candidate_pos].mlen;  /* can be 1, means literal */
                 int const next_offset = opt[candidate_pos].off;
                 DEBUGLOG(7, "pos %i: sequence length %i", candidate_pos, selected_matchLength);
                 opt[candidate_pos].mlen = selected_matchLength;
                 opt[candidate_pos].off = selected_offset;
                 selected_matchLength = next_matchLength;
                 selected_offset = next_offset;
                 if (next_matchLength > candidate_pos) break; /* last match elected, first match to encode */
                 assert(next_matchLength > 0);  /* can be 1, means literal */
                 candidate_pos -= next_matchLength;
         }   }

         /* encode all recorded sequences in order */
         {   int rPos = 0;  /* relative position (to ip) */
             while (rPos < last_match_pos) {
                 int const ml = opt[rPos].mlen;
                 int const offset = opt[rPos].off;
                 if (ml == 1) { ip++; rPos++; continue; }  /* literal; note: can end up with several literals, in which case, skip them */
                 rPos += ml;
                 assert(ml >= MINMATCH);
                 assert((offset >= 1) && (offset <= LZ4_DISTANCE_MAX));
                 opSaved = op;
                 if ( LZ4HC_encodeSequence(UPDATABLE(ip, op, anchor), ml, ip - offset, limit, oend) ) {  /* updates ip, op and anchor */
                     ovml = ml;
                     ovref = ip - offset;
                     goto _dest_overflow;
         }   }   }
     }  /* while (ip <= mflimit) */

_last_literals:
     /* Encode Last Literals */
     {   size_t lastRunSize = (size_t)(iend - anchor);  /* literals */
         size_t llAdd = (lastRunSize + 255 - RUN_MASK) / 255;
         size_t const totalSize = 1 + llAdd + lastRunSize;
         if (limit == fillOutput) oend += LASTLITERALS;  /* restore correct value */
         if (limit && (op + totalSize > oend)) {
             if (limit == limitedOutput) { /* Check output limit */
                retval = 0;
                goto _return_label;
             }
             /* adapt lastRunSize to fill 'dst' */
             lastRunSize  = (size_t)(oend - op) - 1 /*token*/;
             llAdd = (lastRunSize + 256 - RUN_MASK) / 256;
             lastRunSize -= llAdd;
         }
         DEBUGLOG(6, "Final literal run : %i literals", (int)lastRunSize);
         ip = anchor + lastRunSize; /* can be != iend if limit==fillOutput */

         if (lastRunSize >= RUN_MASK) {
             size_t accumulator = lastRunSize - RUN_MASK;
             *op++ = (RUN_MASK << ML_BITS);
             for(; accumulator >= 255 ; accumulator -= 255) *op++ = 255;
             *op++ = (BYTE) accumulator;
         } else {
             *op++ = (BYTE)(lastRunSize << ML_BITS);
         }
         memcpy(op, anchor, lastRunSize);
         op += lastRunSize;
     }

     /* End */
     *srcSizePtr = (int) (((const char*)ip) - source);
     retval = (int) ((char*)op-dst);
     goto _return_label;

_dest_overflow:
if (limit == fillOutput) {
     /* Assumption : ip, anchor, ovml and ovref must be set correctly */
     size_t const ll = (size_t)(ip - anchor);
     size_t const ll_addbytes = (ll + 240) / 255;
     size_t const ll_totalCost = 1 + ll_addbytes + ll;
     BYTE* const maxLitPos = oend - 3; /* 2 for offset, 1 for token */
     DEBUGLOG(6, "Last sequence overflowing (only %i bytes remaining)", (int)(oend-1-opSaved));
     op = opSaved;  /* restore correct out pointer */
     if (op + ll_totalCost <= maxLitPos) {
         /* ll validated; now adjust match length */
         size_t const bytesLeftForMl = (size_t)(maxLitPos - (op+ll_totalCost));
         size_t const maxMlSize = MINMATCH + (ML_MASK-1) + (bytesLeftForMl * 255);
         assert(maxMlSize < INT_MAX); assert(ovml >= 0);
         if ((size_t)ovml > maxMlSize) ovml = (int)maxMlSize;
         if ((oend + LASTLITERALS) - (op + ll_totalCost + 2) - 1 + ovml >= MFLIMIT) {
             DEBUGLOG(6, "Space to end : %i + ml (%i)", (int)((oend + LASTLITERALS) - (op + ll_totalCost + 2) - 1), ovml);
             DEBUGLOG(6, "Before : ip = %p, anchor = %p", ip, anchor);
             LZ4HC_encodeSequence(UPDATABLE(ip, op, anchor), ovml, ovref, notLimited, oend);
             DEBUGLOG(6, "After : ip = %p, anchor = %p", ip, anchor);
     }   }
     goto _last_literals;
}
_return_label:
#ifdef LZ4HC_HEAPMODE
     FREEMEM(opt);
#endif
     return retval;
}